

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Primitive PVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  long lVar9;
  __int_type_conflict _Var10;
  RTCFilterFunctionN p_Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  bool bVar24;
  bool bVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  byte bVar31;
  uint uVar32;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ulong uVar34;
  uint uVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar54 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar94 [64];
  undefined1 auVar96 [64];
  undefined1 auVar98 [64];
  undefined1 auVar100 [64];
  undefined1 auVar102 [64];
  float fVar103;
  undefined4 uVar104;
  vfloat4 a0_2;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar109 [64];
  float t1;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  vfloat4 b0;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar123;
  float fVar124;
  vfloat4 a0_3;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  __m128 a_1;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  float fVar163;
  float fVar164;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar167 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar174 [16];
  undefined1 auVar183 [32];
  __m128 a;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar193;
  float fVar194;
  float fVar204;
  float fVar206;
  float fVar208;
  undefined1 auVar195 [16];
  float fVar205;
  float fVar207;
  float fVar209;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar210;
  float fVar219;
  float fVar220;
  vfloat4 a0_1;
  undefined1 auVar211 [16];
  float fVar221;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  vfloat4 a0;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  uint local_628;
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  uint auStack_600 [4];
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [16];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar33;
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  undefined1 auVar95 [64];
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  undefined1 auVar101 [64];
  undefined1 auVar230 [32];
  
  PVar5 = prim[1];
  uVar28 = (ulong)(byte)PVar5;
  fVar124 = *(float *)(prim + uVar28 * 0x19 + 0x12);
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar48 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar42 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar43 = vsubps_avx(auVar40,*(undefined1 (*) [16])(prim + uVar28 * 0x19 + 6));
  fVar123 = fVar124 * auVar43._0_4_;
  fVar103 = fVar124 * auVar42._0_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar28 * 4 + 6);
  auVar71 = vpmovsxbd_avx2(auVar40);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar28 * 5 + 6);
  auVar69 = vpmovsxbd_avx2(auVar48);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar28 * 6 + 6);
  auVar72 = vpmovsxbd_avx2(auVar3);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar28 * 0xb + 6);
  auVar82 = vpmovsxbd_avx2(auVar49);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  auVar76 = vpmovsxbd_avx2(auVar50);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar83 = vcvtdq2ps_avx(auVar76);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + (uint)(byte)PVar5 * 0xc + uVar28 + 6);
  auVar70 = vpmovsxbd_avx2(auVar45);
  auVar70 = vcvtdq2ps_avx(auVar70);
  uVar34 = (ulong)(uint)((int)(uVar28 * 9) * 2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar34 + 6);
  auVar73 = vpmovsxbd_avx2(auVar4);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar34 + uVar28 + 6);
  auVar74 = vpmovsxbd_avx2(auVar51);
  auVar74 = vcvtdq2ps_avx(auVar74);
  uVar26 = (ulong)(uint)((int)(uVar28 * 5) << 2);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar26 + 6);
  auVar68 = vpmovsxbd_avx2(auVar41);
  auVar75 = vcvtdq2ps_avx(auVar68);
  auVar146._4_4_ = fVar103;
  auVar146._0_4_ = fVar103;
  auVar146._8_4_ = fVar103;
  auVar146._12_4_ = fVar103;
  auVar146._16_4_ = fVar103;
  auVar146._20_4_ = fVar103;
  auVar146._24_4_ = fVar103;
  auVar146._28_4_ = fVar103;
  auVar236._8_4_ = 1;
  auVar236._0_8_ = 0x100000001;
  auVar236._12_4_ = 1;
  auVar236._16_4_ = 1;
  auVar236._20_4_ = 1;
  auVar236._24_4_ = 1;
  auVar236._28_4_ = 1;
  auVar66 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar78 = ZEXT1632(CONCAT412(fVar124 * auVar42._12_4_,
                               CONCAT48(fVar124 * auVar42._8_4_,
                                        CONCAT44(fVar124 * auVar42._4_4_,fVar103))));
  auVar77 = vpermps_avx2(auVar236,auVar78);
  auVar67 = vpermps_avx512vl(auVar66,auVar78);
  fVar103 = auVar67._0_4_;
  fVar194 = auVar67._4_4_;
  auVar78._4_4_ = fVar194 * auVar72._4_4_;
  auVar78._0_4_ = fVar103 * auVar72._0_4_;
  fVar205 = auVar67._8_4_;
  auVar78._8_4_ = fVar205 * auVar72._8_4_;
  fVar207 = auVar67._12_4_;
  auVar78._12_4_ = fVar207 * auVar72._12_4_;
  fVar110 = auVar67._16_4_;
  auVar78._16_4_ = fVar110 * auVar72._16_4_;
  fVar111 = auVar67._20_4_;
  auVar78._20_4_ = fVar111 * auVar72._20_4_;
  fVar112 = auVar67._24_4_;
  auVar78._24_4_ = fVar112 * auVar72._24_4_;
  auVar78._28_4_ = auVar76._28_4_;
  auVar76._4_4_ = auVar70._4_4_ * fVar194;
  auVar76._0_4_ = auVar70._0_4_ * fVar103;
  auVar76._8_4_ = auVar70._8_4_ * fVar205;
  auVar76._12_4_ = auVar70._12_4_ * fVar207;
  auVar76._16_4_ = auVar70._16_4_ * fVar110;
  auVar76._20_4_ = auVar70._20_4_ * fVar111;
  auVar76._24_4_ = auVar70._24_4_ * fVar112;
  auVar76._28_4_ = auVar68._28_4_;
  auVar68._4_4_ = auVar75._4_4_ * fVar194;
  auVar68._0_4_ = auVar75._0_4_ * fVar103;
  auVar68._8_4_ = auVar75._8_4_ * fVar205;
  auVar68._12_4_ = auVar75._12_4_ * fVar207;
  auVar68._16_4_ = auVar75._16_4_ * fVar110;
  auVar68._20_4_ = auVar75._20_4_ * fVar111;
  auVar68._24_4_ = auVar75._24_4_ * fVar112;
  auVar68._28_4_ = auVar67._28_4_;
  auVar40 = vfmadd231ps_fma(auVar78,auVar77,auVar69);
  auVar48 = vfmadd231ps_fma(auVar76,auVar77,auVar83);
  auVar3 = vfmadd231ps_fma(auVar68,auVar74,auVar77);
  auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar146,auVar71);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar146,auVar82);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar73,auVar146);
  auVar226._4_4_ = fVar123;
  auVar226._0_4_ = fVar123;
  auVar226._8_4_ = fVar123;
  auVar226._12_4_ = fVar123;
  auVar226._16_4_ = fVar123;
  auVar226._20_4_ = fVar123;
  auVar226._24_4_ = fVar123;
  auVar226._28_4_ = fVar123;
  auVar68 = ZEXT1632(CONCAT412(fVar124 * auVar43._12_4_,
                               CONCAT48(fVar124 * auVar43._8_4_,
                                        CONCAT44(fVar124 * auVar43._4_4_,fVar123))));
  auVar76 = vpermps_avx2(auVar236,auVar68);
  auVar68 = vpermps_avx512vl(auVar66,auVar68);
  fVar124 = auVar68._0_4_;
  fVar103 = auVar68._4_4_;
  auVar77._4_4_ = fVar103 * auVar72._4_4_;
  auVar77._0_4_ = fVar124 * auVar72._0_4_;
  fVar194 = auVar68._8_4_;
  auVar77._8_4_ = fVar194 * auVar72._8_4_;
  fVar205 = auVar68._12_4_;
  auVar77._12_4_ = fVar205 * auVar72._12_4_;
  fVar207 = auVar68._16_4_;
  auVar77._16_4_ = fVar207 * auVar72._16_4_;
  fVar110 = auVar68._20_4_;
  auVar77._20_4_ = fVar110 * auVar72._20_4_;
  fVar111 = auVar68._24_4_;
  auVar77._24_4_ = fVar111 * auVar72._24_4_;
  auVar77._28_4_ = 1;
  auVar66._4_4_ = auVar70._4_4_ * fVar103;
  auVar66._0_4_ = auVar70._0_4_ * fVar124;
  auVar66._8_4_ = auVar70._8_4_ * fVar194;
  auVar66._12_4_ = auVar70._12_4_ * fVar205;
  auVar66._16_4_ = auVar70._16_4_ * fVar207;
  auVar66._20_4_ = auVar70._20_4_ * fVar110;
  auVar66._24_4_ = auVar70._24_4_ * fVar111;
  auVar66._28_4_ = auVar72._28_4_;
  auVar70._4_4_ = auVar75._4_4_ * fVar103;
  auVar70._0_4_ = auVar75._0_4_ * fVar124;
  auVar70._8_4_ = auVar75._8_4_ * fVar194;
  auVar70._12_4_ = auVar75._12_4_ * fVar205;
  auVar70._16_4_ = auVar75._16_4_ * fVar207;
  auVar70._20_4_ = auVar75._20_4_ * fVar110;
  auVar70._24_4_ = auVar75._24_4_ * fVar111;
  auVar70._28_4_ = auVar68._28_4_;
  auVar49 = vfmadd231ps_fma(auVar77,auVar76,auVar69);
  auVar50 = vfmadd231ps_fma(auVar66,auVar76,auVar83);
  auVar45 = vfmadd231ps_fma(auVar70,auVar76,auVar74);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar226,auVar71);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar226,auVar82);
  auVar85._8_4_ = 0x7fffffff;
  auVar85._0_8_ = 0x7fffffff7fffffff;
  auVar85._12_4_ = 0x7fffffff;
  auVar85._16_4_ = 0x7fffffff;
  auVar85._20_4_ = 0x7fffffff;
  auVar85._24_4_ = 0x7fffffff;
  auVar85._28_4_ = 0x7fffffff;
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar226,auVar73);
  auVar71 = vandps_avx(ZEXT1632(auVar40),auVar85);
  auVar134._8_4_ = 0x219392ef;
  auVar134._0_8_ = 0x219392ef219392ef;
  auVar134._12_4_ = 0x219392ef;
  auVar134._16_4_ = 0x219392ef;
  auVar134._20_4_ = 0x219392ef;
  auVar134._24_4_ = 0x219392ef;
  auVar134._28_4_ = 0x219392ef;
  uVar34 = vcmpps_avx512vl(auVar71,auVar134,1);
  bVar25 = (bool)((byte)uVar34 & 1);
  auVar67._0_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar40._0_4_;
  bVar25 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar40._4_4_;
  bVar25 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar40._8_4_;
  bVar25 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar40._12_4_;
  auVar67._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * 0x219392ef;
  auVar67._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * 0x219392ef;
  auVar67._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * 0x219392ef;
  auVar67._28_4_ = (uint)(byte)(uVar34 >> 7) * 0x219392ef;
  auVar71 = vandps_avx(ZEXT1632(auVar48),auVar85);
  uVar34 = vcmpps_avx512vl(auVar71,auVar134,1);
  bVar25 = (bool)((byte)uVar34 & 1);
  auVar79._0_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar48._0_4_;
  bVar25 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar48._4_4_;
  bVar25 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar48._8_4_;
  bVar25 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar48._12_4_;
  auVar79._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * 0x219392ef;
  auVar79._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * 0x219392ef;
  auVar79._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * 0x219392ef;
  auVar79._28_4_ = (uint)(byte)(uVar34 >> 7) * 0x219392ef;
  auVar71 = vandps_avx(ZEXT1632(auVar3),auVar85);
  uVar34 = vcmpps_avx512vl(auVar71,auVar134,1);
  bVar25 = (bool)((byte)uVar34 & 1);
  auVar71._0_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar3._0_4_;
  bVar25 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar3._4_4_;
  bVar25 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar3._8_4_;
  bVar25 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar3._12_4_;
  auVar71._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * 0x219392ef;
  auVar71._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * 0x219392ef;
  auVar71._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * 0x219392ef;
  auVar71._28_4_ = (uint)(byte)(uVar34 >> 7) * 0x219392ef;
  auVar69 = vrcp14ps_avx512vl(auVar67);
  auVar86._8_4_ = 0x3f800000;
  auVar86._0_8_ = 0x3f8000003f800000;
  auVar86._12_4_ = 0x3f800000;
  auVar86._16_4_ = 0x3f800000;
  auVar86._20_4_ = 0x3f800000;
  auVar86._24_4_ = 0x3f800000;
  auVar86._28_4_ = 0x3f800000;
  auVar40 = vfnmadd213ps_fma(auVar67,auVar69,auVar86);
  auVar40 = vfmadd132ps_fma(ZEXT1632(auVar40),auVar69,auVar69);
  auVar69 = vrcp14ps_avx512vl(auVar79);
  auVar48 = vfnmadd213ps_fma(auVar79,auVar69,auVar86);
  auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar69,auVar69);
  auVar69 = vrcp14ps_avx512vl(auVar71);
  auVar3 = vfnmadd213ps_fma(auVar71,auVar69,auVar86);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar69,auVar69);
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 7 + 6));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar71 = vsubps_avx(auVar71,ZEXT1632(auVar49));
  auVar73._4_4_ = auVar40._4_4_ * auVar71._4_4_;
  auVar73._0_4_ = auVar40._0_4_ * auVar71._0_4_;
  auVar73._8_4_ = auVar40._8_4_ * auVar71._8_4_;
  auVar73._12_4_ = auVar40._12_4_ * auVar71._12_4_;
  auVar73._16_4_ = auVar71._16_4_ * 0.0;
  auVar73._20_4_ = auVar71._20_4_ * 0.0;
  auVar73._24_4_ = auVar71._24_4_ * 0.0;
  auVar73._28_4_ = auVar71._28_4_;
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 9 + 6));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar71 = vsubps_avx(auVar71,ZEXT1632(auVar49));
  auVar70 = vpbroadcastd_avx512vl();
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar5 * 0x10 + 6));
  auVar84._0_4_ = auVar40._0_4_ * auVar71._0_4_;
  auVar84._4_4_ = auVar40._4_4_ * auVar71._4_4_;
  auVar84._8_4_ = auVar40._8_4_ * auVar71._8_4_;
  auVar84._12_4_ = auVar40._12_4_ * auVar71._12_4_;
  auVar84._16_4_ = auVar71._16_4_ * 0.0;
  auVar84._20_4_ = auVar71._20_4_ * 0.0;
  auVar84._24_4_ = auVar71._24_4_ * 0.0;
  auVar84._28_4_ = 0;
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar5 * 0x10 + uVar28 * -2 + 6));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar71 = vsubps_avx(auVar71,ZEXT1632(auVar50));
  auVar74._4_4_ = auVar48._4_4_ * auVar71._4_4_;
  auVar74._0_4_ = auVar48._0_4_ * auVar71._0_4_;
  auVar74._8_4_ = auVar48._8_4_ * auVar71._8_4_;
  auVar74._12_4_ = auVar48._12_4_ * auVar71._12_4_;
  auVar74._16_4_ = auVar71._16_4_ * 0.0;
  auVar74._20_4_ = auVar71._20_4_ * 0.0;
  auVar74._24_4_ = auVar71._24_4_ * 0.0;
  auVar74._28_4_ = auVar71._28_4_;
  auVar71 = vcvtdq2ps_avx(auVar69);
  auVar71 = vsubps_avx(auVar71,ZEXT1632(auVar50));
  auVar81._0_4_ = auVar48._0_4_ * auVar71._0_4_;
  auVar81._4_4_ = auVar48._4_4_ * auVar71._4_4_;
  auVar81._8_4_ = auVar48._8_4_ * auVar71._8_4_;
  auVar81._12_4_ = auVar48._12_4_ * auVar71._12_4_;
  auVar81._16_4_ = auVar71._16_4_ * 0.0;
  auVar81._20_4_ = auVar71._20_4_ * 0.0;
  auVar81._24_4_ = auVar71._24_4_ * 0.0;
  auVar81._28_4_ = 0;
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 + uVar28 + 6));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar71 = vsubps_avx(auVar71,ZEXT1632(auVar45));
  auVar75._4_4_ = auVar71._4_4_ * auVar3._4_4_;
  auVar75._0_4_ = auVar71._0_4_ * auVar3._0_4_;
  auVar75._8_4_ = auVar71._8_4_ * auVar3._8_4_;
  auVar75._12_4_ = auVar71._12_4_ * auVar3._12_4_;
  auVar75._16_4_ = auVar71._16_4_ * 0.0;
  auVar75._20_4_ = auVar71._20_4_ * 0.0;
  auVar75._24_4_ = auVar71._24_4_ * 0.0;
  auVar75._28_4_ = auVar71._28_4_;
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x17 + 6));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar71 = vsubps_avx(auVar71,ZEXT1632(auVar45));
  auVar80._0_4_ = auVar3._0_4_ * auVar71._0_4_;
  auVar80._4_4_ = auVar3._4_4_ * auVar71._4_4_;
  auVar80._8_4_ = auVar3._8_4_ * auVar71._8_4_;
  auVar80._12_4_ = auVar3._12_4_ * auVar71._12_4_;
  auVar80._16_4_ = auVar71._16_4_ * 0.0;
  auVar80._20_4_ = auVar71._20_4_ * 0.0;
  auVar80._24_4_ = auVar71._24_4_ * 0.0;
  auVar80._28_4_ = 0;
  auVar71 = vpminsd_avx2(auVar73,auVar84);
  auVar69 = vpminsd_avx2(auVar74,auVar81);
  auVar71 = vmaxps_avx(auVar71,auVar69);
  auVar69 = vpminsd_avx2(auVar75,auVar80);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar72._4_4_ = uVar104;
  auVar72._0_4_ = uVar104;
  auVar72._8_4_ = uVar104;
  auVar72._12_4_ = uVar104;
  auVar72._16_4_ = uVar104;
  auVar72._20_4_ = uVar104;
  auVar72._24_4_ = uVar104;
  auVar72._28_4_ = uVar104;
  auVar69 = vmaxps_avx512vl(auVar69,auVar72);
  auVar71 = vmaxps_avx(auVar71,auVar69);
  auVar69._8_4_ = 0x3f7ffffa;
  auVar69._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar69._12_4_ = 0x3f7ffffa;
  auVar69._16_4_ = 0x3f7ffffa;
  auVar69._20_4_ = 0x3f7ffffa;
  auVar69._24_4_ = 0x3f7ffffa;
  auVar69._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar71,auVar69);
  auVar71 = vpmaxsd_avx2(auVar73,auVar84);
  auVar69 = vpmaxsd_avx2(auVar74,auVar81);
  auVar71 = vminps_avx(auVar71,auVar69);
  auVar69 = vpmaxsd_avx2(auVar75,auVar80);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar82._4_4_ = uVar104;
  auVar82._0_4_ = uVar104;
  auVar82._8_4_ = uVar104;
  auVar82._12_4_ = uVar104;
  auVar82._16_4_ = uVar104;
  auVar82._20_4_ = uVar104;
  auVar82._24_4_ = uVar104;
  auVar82._28_4_ = uVar104;
  auVar69 = vminps_avx512vl(auVar69,auVar82);
  auVar71 = vminps_avx(auVar71,auVar69);
  auVar83._8_4_ = 0x3f800003;
  auVar83._0_8_ = 0x3f8000033f800003;
  auVar83._12_4_ = 0x3f800003;
  auVar83._16_4_ = 0x3f800003;
  auVar83._20_4_ = 0x3f800003;
  auVar83._24_4_ = 0x3f800003;
  auVar83._28_4_ = 0x3f800003;
  auVar71 = vmulps_avx512vl(auVar71,auVar83);
  uVar13 = vpcmpgtd_avx512vl(auVar70,_DAT_01fe9900);
  uVar12 = vcmpps_avx512vl(local_3c0,auVar71,2);
  if ((byte)((byte)uVar12 & (byte)uVar13) == 0) {
    return false;
  }
  uVar34 = (ulong)(byte)((byte)uVar12 & (byte)uVar13);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar245 = ZEXT1664(auVar40);
  auVar109 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar109);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar109 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar237 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar238 = ZEXT1664(auVar40);
  auVar244 = ZEXT464(0x3f800000);
  auVar40 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar243 = ZEXT1664(auVar40);
LAB_01d07020:
  lVar30 = 0;
  for (uVar26 = uVar34; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar30 = lVar30 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  lVar9 = *(long *)&pGVar8[1].time_range.upper;
  uVar26 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar30 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar40 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * uVar26);
  lVar30 = uVar26 + 1;
  auVar48 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * lVar30);
  _Var10 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar3 = *(undefined1 (*) [16])(_Var10 + (long)pGVar8[2].userPtr * uVar26);
  auVar49 = *(undefined1 (*) [16])(_Var10 + (long)pGVar8[2].userPtr * lVar30);
  auVar87 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar87);
  auVar50 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar65 = auVar245._0_16_;
  auVar41 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar8[2].intersectionFilterN + (long)pGVar8[2].pointQueryFunc * uVar26),
                       auVar40,auVar65);
  auVar42 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar8[2].intersectionFilterN + (long)pGVar8[2].pointQueryFunc * lVar30),
                       auVar48,auVar65);
  auVar43 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar8[3].userPtr + uVar26 * *(long *)&pGVar8[3].fnumTimeSegments),
                       auVar3,auVar65);
  auVar44 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar8[3].userPtr + *(long *)&pGVar8[3].fnumTimeSegments * lVar30),
                       auVar49,auVar65);
  auVar113 = ZEXT816(0) << 0x40;
  auVar155._0_4_ = auVar48._0_4_ * 0.0;
  auVar155._4_4_ = auVar48._4_4_ * 0.0;
  auVar155._8_4_ = auVar48._8_4_ * 0.0;
  auVar155._12_4_ = auVar48._12_4_ * 0.0;
  auVar4 = vfmadd231ps_fma(auVar155,auVar42,auVar113);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar41,auVar4);
  auVar165._0_4_ = auVar45._0_4_ + auVar40._0_4_;
  auVar165._4_4_ = auVar45._4_4_ + auVar40._4_4_;
  auVar165._8_4_ = auVar45._8_4_ + auVar40._8_4_;
  auVar165._12_4_ = auVar45._12_4_ + auVar40._12_4_;
  auVar54 = auVar109._0_16_;
  auVar45 = vfmadd231ps_avx512vl(auVar4,auVar41,auVar54);
  auVar46 = vfnmadd231ps_avx512vl(auVar45,auVar40,auVar54);
  auVar211._0_4_ = auVar49._0_4_ * 0.0;
  auVar211._4_4_ = auVar49._4_4_ * 0.0;
  auVar211._8_4_ = auVar49._8_4_ * 0.0;
  auVar211._12_4_ = auVar49._12_4_ * 0.0;
  auVar4 = vfmadd231ps_fma(auVar211,auVar44,auVar113);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar43,auVar4);
  auVar222._0_4_ = auVar45._0_4_ + auVar3._0_4_;
  auVar222._4_4_ = auVar45._4_4_ + auVar3._4_4_;
  auVar222._8_4_ = auVar45._8_4_ + auVar3._8_4_;
  auVar222._12_4_ = auVar45._12_4_ + auVar3._12_4_;
  auVar45 = vfmadd231ps_avx512vl(auVar4,auVar43,auVar54);
  auVar47 = vfnmadd231ps_avx512vl(auVar45,auVar3,auVar54);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar42,auVar48);
  auVar45 = vfmadd231ps_fma(auVar45,auVar41,auVar113);
  auVar51 = vfmadd231ps_fma(auVar45,auVar40,auVar113);
  auVar48 = vmulps_avx512vl(auVar48,auVar54);
  auVar48 = vfnmadd231ps_avx512vl(auVar48,auVar54,auVar42);
  auVar48 = vfmadd231ps_fma(auVar48,auVar113,auVar41);
  auVar41 = vfnmadd231ps_fma(auVar48,auVar113,auVar40);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar44,auVar49);
  auVar40 = vfmadd231ps_fma(auVar40,auVar43,auVar113);
  auVar45 = vfmadd231ps_fma(auVar40,auVar3,auVar113);
  auVar40 = vmulps_avx512vl(auVar49,auVar54);
  auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar54,auVar44);
  auVar40 = vfmadd231ps_fma(auVar40,auVar113,auVar43);
  auVar4 = vfnmadd231ps_fma(auVar40,auVar113,auVar3);
  auVar40 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar48 = vshufps_avx(auVar222,auVar222,0xc9);
  fVar123 = auVar46._0_4_;
  auVar55._0_4_ = fVar123 * auVar48._0_4_;
  fVar163 = auVar46._4_4_;
  auVar55._4_4_ = fVar163 * auVar48._4_4_;
  fVar164 = auVar46._8_4_;
  auVar55._8_4_ = fVar164 * auVar48._8_4_;
  fVar209 = auVar46._12_4_;
  auVar55._12_4_ = fVar209 * auVar48._12_4_;
  auVar48 = vfmsub231ps_fma(auVar55,auVar40,auVar222);
  auVar3 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar48 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar136._0_4_ = fVar123 * auVar48._0_4_;
  auVar136._4_4_ = fVar163 * auVar48._4_4_;
  auVar136._8_4_ = fVar164 * auVar48._8_4_;
  auVar136._12_4_ = fVar209 * auVar48._12_4_;
  auVar40 = vfmsub231ps_fma(auVar136,auVar40,auVar47);
  auVar49 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar48 = vshufps_avx(auVar45,auVar45,0xc9);
  fVar124 = auVar41._0_4_;
  auVar184._0_4_ = auVar48._0_4_ * fVar124;
  fVar103 = auVar41._4_4_;
  auVar184._4_4_ = auVar48._4_4_ * fVar103;
  fVar194 = auVar41._8_4_;
  auVar184._8_4_ = auVar48._8_4_ * fVar194;
  fVar205 = auVar41._12_4_;
  auVar184._12_4_ = auVar48._12_4_ * fVar205;
  auVar48 = vfmsub231ps_fma(auVar184,auVar40,auVar45);
  auVar45 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar48 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar185._0_4_ = auVar48._0_4_ * fVar124;
  auVar185._4_4_ = auVar48._4_4_ * fVar103;
  auVar185._8_4_ = auVar48._8_4_ * fVar194;
  auVar185._12_4_ = auVar48._12_4_ * fVar205;
  auVar40 = vfmsub231ps_fma(auVar185,auVar40,auVar4);
  auVar4 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vdpps_avx(auVar3,auVar3,0x7f);
  fVar207 = auVar40._0_4_;
  auVar186._4_12_ = ZEXT812(0) << 0x20;
  auVar186._0_4_ = fVar207;
  auVar48 = vrsqrt14ss_avx512f(auVar113,auVar186);
  auVar42 = vmulss_avx512f(auVar48,ZEXT416(0x3fc00000));
  auVar43 = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
  fVar110 = auVar48._0_4_;
  fVar111 = auVar42._0_4_ - auVar43._0_4_ * fVar110 * fVar110 * fVar110;
  fVar210 = fVar111 * auVar3._0_4_;
  fVar219 = fVar111 * auVar3._4_4_;
  fVar220 = fVar111 * auVar3._8_4_;
  fVar221 = fVar111 * auVar3._12_4_;
  auVar48 = vdpps_avx(auVar3,auVar49,0x7f);
  auVar137._0_4_ = fVar207 * auVar49._0_4_;
  auVar137._4_4_ = fVar207 * auVar49._4_4_;
  auVar137._8_4_ = fVar207 * auVar49._8_4_;
  auVar137._12_4_ = fVar207 * auVar49._12_4_;
  fVar207 = auVar48._0_4_;
  auVar56._0_4_ = fVar207 * auVar3._0_4_;
  auVar56._4_4_ = fVar207 * auVar3._4_4_;
  auVar56._8_4_ = fVar207 * auVar3._8_4_;
  auVar56._12_4_ = fVar207 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar137,auVar56);
  auVar48 = vrcp14ss_avx512f(auVar113,auVar186);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar48,ZEXT416(0x40000000));
  fVar207 = auVar48._0_4_ * auVar40._0_4_;
  auVar40 = vdpps_avx(auVar45,auVar45,0x7f);
  fVar110 = auVar40._0_4_;
  auVar63._4_12_ = ZEXT812(0) << 0x20;
  auVar63._0_4_ = fVar110;
  auVar48 = vrsqrt14ss_avx512f(auVar113,auVar63);
  auVar49 = vmulss_avx512f(auVar48,ZEXT416(0x3fc00000));
  auVar42 = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
  fVar112 = auVar48._0_4_;
  fVar112 = auVar49._0_4_ - auVar42._0_4_ * fVar112 * fVar112 * fVar112;
  fVar193 = fVar112 * auVar45._0_4_;
  fVar204 = fVar112 * auVar45._4_4_;
  fVar206 = fVar112 * auVar45._8_4_;
  fVar208 = fVar112 * auVar45._12_4_;
  auVar48 = vdpps_avx(auVar45,auVar4,0x7f);
  auVar52._0_4_ = fVar110 * auVar4._0_4_;
  auVar52._4_4_ = fVar110 * auVar4._4_4_;
  auVar52._8_4_ = fVar110 * auVar4._8_4_;
  auVar52._12_4_ = fVar110 * auVar4._12_4_;
  fVar110 = auVar48._0_4_;
  auVar43._0_4_ = fVar110 * auVar45._0_4_;
  auVar43._4_4_ = fVar110 * auVar45._4_4_;
  auVar43._8_4_ = fVar110 * auVar45._8_4_;
  auVar43._12_4_ = fVar110 * auVar45._12_4_;
  auVar49 = vsubps_avx(auVar52,auVar43);
  auVar48 = vrcp14ss_avx512f(auVar113,auVar63);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar48,ZEXT416(0x40000000));
  fVar110 = auVar48._0_4_ * auVar40._0_4_;
  auVar40 = vshufps_avx(auVar165,auVar165,0xff);
  auVar64._0_4_ = fVar210 * auVar40._0_4_;
  auVar64._4_4_ = fVar219 * auVar40._4_4_;
  auVar64._8_4_ = fVar220 * auVar40._8_4_;
  auVar64._12_4_ = fVar221 * auVar40._12_4_;
  local_510 = vsubps_avx(auVar165,auVar64);
  auVar48 = vshufps_avx(auVar46,auVar46,0xff);
  auVar53._0_4_ = fVar210 * auVar48._0_4_ + auVar40._0_4_ * fVar111 * auVar3._0_4_ * fVar207;
  auVar53._4_4_ = fVar219 * auVar48._4_4_ + auVar40._4_4_ * fVar111 * auVar3._4_4_ * fVar207;
  auVar53._8_4_ = fVar220 * auVar48._8_4_ + auVar40._8_4_ * fVar111 * auVar3._8_4_ * fVar207;
  auVar53._12_4_ = fVar221 * auVar48._12_4_ + auVar40._12_4_ * fVar111 * auVar3._12_4_ * fVar207;
  auVar3 = vsubps_avx(auVar46,auVar53);
  local_520._0_4_ = auVar165._0_4_ + auVar64._0_4_;
  local_520._4_4_ = auVar165._4_4_ + auVar64._4_4_;
  fStack_518 = auVar165._8_4_ + auVar64._8_4_;
  fStack_514 = auVar165._12_4_ + auVar64._12_4_;
  auVar62._0_4_ = fVar123 + auVar53._0_4_;
  auVar62._4_4_ = fVar163 + auVar53._4_4_;
  auVar62._8_4_ = fVar164 + auVar53._8_4_;
  auVar62._12_4_ = fVar209 + auVar53._12_4_;
  auVar40 = vshufps_avx(auVar51,auVar51,0xff);
  auVar138._0_4_ = fVar193 * auVar40._0_4_;
  auVar138._4_4_ = fVar204 * auVar40._4_4_;
  auVar138._8_4_ = fVar206 * auVar40._8_4_;
  auVar138._12_4_ = fVar208 * auVar40._12_4_;
  local_530 = vsubps_avx(auVar51,auVar138);
  auVar48 = vshufps_avx(auVar41,auVar41,0xff);
  auVar44._0_4_ = fVar193 * auVar48._0_4_ + auVar40._0_4_ * fVar112 * auVar49._0_4_ * fVar110;
  auVar44._4_4_ = fVar204 * auVar48._4_4_ + auVar40._4_4_ * fVar112 * auVar49._4_4_ * fVar110;
  auVar44._8_4_ = fVar206 * auVar48._8_4_ + auVar40._8_4_ * fVar112 * auVar49._8_4_ * fVar110;
  auVar44._12_4_ = fVar208 * auVar48._12_4_ + auVar40._12_4_ * fVar112 * auVar49._12_4_ * fVar110;
  auVar40 = vsubps_avx(auVar41,auVar44);
  _local_540 = vaddps_avx512vl(auVar51,auVar138);
  auVar46._0_4_ = fVar124 + auVar44._0_4_;
  auVar46._4_4_ = fVar103 + auVar44._4_4_;
  auVar46._8_4_ = fVar194 + auVar44._8_4_;
  auVar46._12_4_ = fVar205 + auVar44._12_4_;
  auVar48 = vmulps_avx512vl(auVar3,auVar65);
  local_550 = vaddps_avx512vl(local_510,auVar48);
  auVar40 = vmulps_avx512vl(auVar40,auVar65);
  local_560 = vsubps_avx512vl(local_530,auVar40);
  auVar40 = vmulps_avx512vl(auVar62,auVar65);
  _local_570 = vaddps_avx512vl(_local_520,auVar40);
  auVar40 = vmulps_avx512vl(auVar46,auVar65);
  _local_580 = vsubps_avx512vl(_local_540,auVar40);
  local_490 = vsubps_avx(local_510,auVar50);
  uVar104 = local_490._0_4_;
  auVar113._4_4_ = uVar104;
  auVar113._0_4_ = uVar104;
  auVar113._8_4_ = uVar104;
  auVar113._12_4_ = uVar104;
  auVar40 = vshufps_avx(local_490,local_490,0x55);
  auVar48 = vshufps_avx(local_490,local_490,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar124 = pre->ray_space[k].vz.field_0.m128[0];
  fVar103 = pre->ray_space[k].vz.field_0.m128[1];
  fVar194 = pre->ray_space[k].vz.field_0.m128[2];
  fVar205 = pre->ray_space[k].vz.field_0.m128[3];
  auVar47._0_4_ = fVar124 * auVar48._0_4_;
  auVar47._4_4_ = fVar103 * auVar48._4_4_;
  auVar47._8_4_ = fVar194 * auVar48._8_4_;
  auVar47._12_4_ = fVar205 * auVar48._12_4_;
  auVar40 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar2,auVar40);
  auVar51 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar113);
  local_4a0 = vsubps_avx512vl(local_550,auVar50);
  uVar104 = local_4a0._0_4_;
  auVar65._4_4_ = uVar104;
  auVar65._0_4_ = uVar104;
  auVar65._8_4_ = uVar104;
  auVar65._12_4_ = uVar104;
  auVar40 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar48 = vshufps_avx(local_4a0,local_4a0,0xaa);
  auVar54._0_4_ = fVar124 * auVar48._0_4_;
  auVar54._4_4_ = fVar103 * auVar48._4_4_;
  auVar54._8_4_ = fVar194 * auVar48._8_4_;
  auVar54._12_4_ = fVar205 * auVar48._12_4_;
  auVar40 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar2,auVar40);
  auVar41 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar65);
  local_4b0 = vsubps_avx512vl(local_560,auVar50);
  uVar104 = local_4b0._0_4_;
  auVar57._4_4_ = uVar104;
  auVar57._0_4_ = uVar104;
  auVar57._8_4_ = uVar104;
  auVar57._12_4_ = uVar104;
  auVar40 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar48 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar166._0_4_ = auVar48._0_4_ * fVar124;
  auVar166._4_4_ = auVar48._4_4_ * fVar103;
  auVar166._8_4_ = auVar48._8_4_ * fVar194;
  auVar166._12_4_ = auVar48._12_4_ * fVar205;
  auVar40 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar2,auVar40);
  auVar42 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar57);
  local_4c0 = vsubps_avx(local_530,auVar50);
  uVar104 = local_4c0._0_4_;
  auVar58._4_4_ = uVar104;
  auVar58._0_4_ = uVar104;
  auVar58._8_4_ = uVar104;
  auVar58._12_4_ = uVar104;
  auVar40 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar48 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar173._0_4_ = auVar48._0_4_ * fVar124;
  auVar173._4_4_ = auVar48._4_4_ * fVar103;
  auVar173._8_4_ = auVar48._8_4_ * fVar194;
  auVar173._12_4_ = auVar48._12_4_ * fVar205;
  auVar40 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar2,auVar40);
  auVar43 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar58);
  local_4d0 = vsubps_avx(_local_520,auVar50);
  uVar104 = local_4d0._0_4_;
  auVar61._4_4_ = uVar104;
  auVar61._0_4_ = uVar104;
  auVar61._8_4_ = uVar104;
  auVar61._12_4_ = uVar104;
  auVar40 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar48 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar187._0_4_ = auVar48._0_4_ * fVar124;
  auVar187._4_4_ = auVar48._4_4_ * fVar103;
  auVar187._8_4_ = auVar48._8_4_ * fVar194;
  auVar187._12_4_ = auVar48._12_4_ * fVar205;
  auVar40 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar2,auVar40);
  auVar44 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar61);
  local_4e0 = vsubps_avx512vl(_local_570,auVar50);
  uVar104 = local_4e0._0_4_;
  auVar59._4_4_ = uVar104;
  auVar59._0_4_ = uVar104;
  auVar59._8_4_ = uVar104;
  auVar59._12_4_ = uVar104;
  auVar40 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar48 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar195._0_4_ = auVar48._0_4_ * fVar124;
  auVar195._4_4_ = auVar48._4_4_ * fVar103;
  auVar195._8_4_ = auVar48._8_4_ * fVar194;
  auVar195._12_4_ = auVar48._12_4_ * fVar205;
  auVar40 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar2,auVar40);
  auVar46 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar59);
  local_4f0 = vsubps_avx512vl(_local_580,auVar50);
  uVar104 = local_4f0._0_4_;
  auVar60._4_4_ = uVar104;
  auVar60._0_4_ = uVar104;
  auVar60._8_4_ = uVar104;
  auVar60._12_4_ = uVar104;
  auVar40 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar48 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar212._0_4_ = auVar48._0_4_ * fVar124;
  auVar212._4_4_ = auVar48._4_4_ * fVar103;
  auVar212._8_4_ = auVar48._8_4_ * fVar194;
  auVar212._12_4_ = auVar48._12_4_ * fVar205;
  auVar40 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar2,auVar40);
  auVar47 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar60);
  local_500 = vsubps_avx512vl(_local_540,auVar50);
  uVar104 = local_500._0_4_;
  auVar115._4_4_ = uVar104;
  auVar115._0_4_ = uVar104;
  auVar115._8_4_ = uVar104;
  auVar115._12_4_ = uVar104;
  auVar40 = vshufps_avx(local_500,local_500,0x55);
  auVar48 = vshufps_avx(local_500,local_500,0xaa);
  auVar139._0_4_ = fVar124 * auVar48._0_4_;
  auVar139._4_4_ = fVar103 * auVar48._4_4_;
  auVar139._8_4_ = fVar194 * auVar48._8_4_;
  auVar139._12_4_ = fVar205 * auVar48._12_4_;
  auVar40 = vfmadd231ps_fma(auVar139,(undefined1  [16])aVar2,auVar40);
  auVar113 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar115);
  auVar3 = vmovlhps_avx(auVar51,auVar44);
  auVar49 = vmovlhps_avx(auVar41,auVar46);
  auVar45 = vmovlhps_avx512f(auVar42,auVar47);
  auVar4 = vmovlhps_avx512f(auVar43,auVar113);
  auVar48 = vminps_avx(auVar3,auVar49);
  auVar40 = vmaxps_avx(auVar3,auVar49);
  auVar50 = vminps_avx512vl(auVar45,auVar4);
  auVar48 = vminps_avx(auVar48,auVar50);
  auVar50 = vmaxps_avx512vl(auVar45,auVar4);
  auVar40 = vmaxps_avx(auVar40,auVar50);
  auVar50 = vshufpd_avx(auVar48,auVar48,3);
  auVar48 = vminps_avx(auVar48,auVar50);
  auVar50 = vshufpd_avx(auVar40,auVar40,3);
  auVar40 = vmaxps_avx(auVar40,auVar50);
  auVar48 = vandps_avx512vl(auVar48,auVar237._0_16_);
  auVar40 = vandps_avx512vl(auVar40,auVar237._0_16_);
  auVar40 = vmaxps_avx(auVar48,auVar40);
  auVar48 = vmovshdup_avx(auVar40);
  auVar40 = vmaxss_avx(auVar48,auVar40);
  local_628 = (uint)uVar34 + 0xff;
  fVar124 = auVar40._0_4_ * 9.536743e-07;
  auVar50 = vmovddup_avx512vl(auVar51);
  auVar51 = vmovddup_avx512vl(auVar41);
  auVar167._0_8_ = auVar42._0_8_;
  auVar167._8_8_ = auVar167._0_8_;
  auVar174._0_8_ = auVar43._0_8_;
  auVar174._8_8_ = auVar174._0_8_;
  local_440 = vbroadcastss_avx512vl(ZEXT416((uint)fVar124));
  auVar40 = vxorps_avx512vl(local_440._0_16_,auVar238._0_16_);
  local_460 = vbroadcastss_avx512vl(auVar40);
  bVar25 = false;
  uVar26 = 0;
  uVar35 = *(uint *)(ray + k * 4 + 0xc0);
  auVar40 = vsubps_avx(auVar49,auVar3);
  local_470 = vsubps_avx512vl(auVar45,auVar49);
  local_480 = vsubps_avx512vl(auVar4,auVar45);
  local_590 = vsubps_avx(_local_520,local_510);
  local_5a0 = vsubps_avx512vl(_local_570,local_550);
  local_5b0 = vsubps_avx512vl(_local_580,local_560);
  _local_5c0 = vsubps_avx512vl(_local_540,local_530);
  auVar109 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar109);
  auVar48 = ZEXT816(0x3f80000000000000);
  auVar87._32_32_ = auVar109._32_32_;
  auVar42 = auVar48;
LAB_01d07713:
  do {
    auVar41 = vshufps_avx(auVar42,auVar42,0x50);
    auVar227._8_4_ = 0x3f800000;
    auVar227._0_8_ = 0x3f8000003f800000;
    auVar227._12_4_ = 0x3f800000;
    auVar230._16_4_ = 0x3f800000;
    auVar230._0_16_ = auVar227;
    auVar230._20_4_ = 0x3f800000;
    auVar230._24_4_ = 0x3f800000;
    auVar230._28_4_ = 0x3f800000;
    auVar43 = vsubps_avx(auVar227,auVar41);
    fVar103 = auVar41._0_4_;
    fVar110 = auVar44._0_4_;
    auVar131._0_4_ = fVar110 * fVar103;
    fVar194 = auVar41._4_4_;
    fVar111 = auVar44._4_4_;
    auVar131._4_4_ = fVar111 * fVar194;
    fVar205 = auVar41._8_4_;
    auVar131._8_4_ = fVar110 * fVar205;
    fVar207 = auVar41._12_4_;
    auVar131._12_4_ = fVar111 * fVar207;
    fVar112 = auVar46._0_4_;
    auVar140._0_4_ = fVar112 * fVar103;
    fVar123 = auVar46._4_4_;
    auVar140._4_4_ = fVar123 * fVar194;
    auVar140._8_4_ = fVar112 * fVar205;
    auVar140._12_4_ = fVar123 * fVar207;
    fVar163 = auVar47._0_4_;
    auVar149._0_4_ = fVar163 * fVar103;
    fVar164 = auVar47._4_4_;
    auVar149._4_4_ = fVar164 * fVar194;
    auVar149._8_4_ = fVar163 * fVar205;
    auVar149._12_4_ = fVar164 * fVar207;
    fVar206 = auVar113._0_4_;
    auVar116._0_4_ = fVar206 * fVar103;
    fVar208 = auVar113._4_4_;
    auVar116._4_4_ = fVar208 * fVar194;
    auVar116._8_4_ = fVar206 * fVar205;
    auVar116._12_4_ = fVar208 * fVar207;
    auVar52 = vfmadd231ps_avx512vl(auVar131,auVar43,auVar50);
    auVar53 = vfmadd231ps_avx512vl(auVar140,auVar43,auVar51);
    auVar54 = vfmadd231ps_fma(auVar149,auVar43,auVar167);
    auVar43 = vfmadd231ps_fma(auVar116,auVar174,auVar43);
    auVar41 = vmovshdup_avx(auVar48);
    fVar194 = auVar48._0_4_;
    fVar103 = (auVar41._0_4_ - fVar194) * 0.04761905;
    auVar172._4_4_ = fVar194;
    auVar172._0_4_ = fVar194;
    auVar172._8_4_ = fVar194;
    auVar172._12_4_ = fVar194;
    auVar172._16_4_ = fVar194;
    auVar172._20_4_ = fVar194;
    auVar172._24_4_ = fVar194;
    auVar172._28_4_ = fVar194;
    auVar129._0_8_ = auVar41._0_8_;
    auVar129._8_8_ = auVar129._0_8_;
    auVar129._16_8_ = auVar129._0_8_;
    auVar129._24_8_ = auVar129._0_8_;
    auVar71 = vsubps_avx(auVar129,auVar172);
    uVar104 = auVar52._0_4_;
    auVar130._4_4_ = uVar104;
    auVar130._0_4_ = uVar104;
    auVar130._8_4_ = uVar104;
    auVar130._12_4_ = uVar104;
    auVar130._16_4_ = uVar104;
    auVar130._20_4_ = uVar104;
    auVar130._24_4_ = uVar104;
    auVar130._28_4_ = uVar104;
    auVar190._8_4_ = 1;
    auVar190._0_8_ = 0x100000001;
    auVar190._12_4_ = 1;
    auVar190._16_4_ = 1;
    auVar190._20_4_ = 1;
    auVar190._24_4_ = 1;
    auVar190._28_4_ = 1;
    auVar82 = ZEXT1632(auVar52);
    auVar69 = vpermps_avx2(auVar190,auVar82);
    auVar72 = vbroadcastss_avx512vl(auVar53);
    auVar83 = ZEXT1632(auVar53);
    auVar70 = vpermps_avx512vl(auVar190,auVar83);
    auVar73 = vbroadcastss_avx512vl(auVar54);
    auVar80 = ZEXT1632(auVar54);
    auVar74 = vpermps_avx512vl(auVar190,auVar80);
    auVar75 = vbroadcastss_avx512vl(auVar43);
    auVar79 = ZEXT1632(auVar43);
    auVar76 = vpermps_avx512vl(auVar190,auVar79);
    auVar191._4_4_ = fVar103;
    auVar191._0_4_ = fVar103;
    auVar191._8_4_ = fVar103;
    auVar191._12_4_ = fVar103;
    auVar191._16_4_ = fVar103;
    auVar191._20_4_ = fVar103;
    auVar191._24_4_ = fVar103;
    auVar191._28_4_ = fVar103;
    auVar68 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar77 = vpermps_avx512vl(auVar68,auVar82);
    auVar162._8_4_ = 3;
    auVar162._0_8_ = 0x300000003;
    auVar162._12_4_ = 3;
    auVar162._16_4_ = 3;
    auVar162._20_4_ = 3;
    auVar162._24_4_ = 3;
    auVar162._28_4_ = 3;
    auVar78 = vpermps_avx512vl(auVar162,auVar82);
    auVar66 = vpermps_avx512vl(auVar68,auVar83);
    auVar82 = vpermps_avx2(auVar162,auVar83);
    auVar67 = vpermps_avx512vl(auVar68,auVar80);
    auVar83 = vpermps_avx2(auVar162,auVar80);
    auVar68 = vpermps_avx512vl(auVar68,auVar79);
    auVar79 = vpermps_avx512vl(auVar162,auVar79);
    auVar41 = vfmadd132ps_fma(auVar71,auVar172,_DAT_01faff20);
    auVar71 = vsubps_avx(auVar230,ZEXT1632(auVar41));
    auVar80 = vmulps_avx512vl(auVar72,ZEXT1632(auVar41));
    auVar84 = ZEXT1632(auVar41);
    auVar81 = vmulps_avx512vl(auVar70,auVar84);
    auVar43 = vfmadd231ps_fma(auVar80,auVar71,auVar130);
    auVar54 = vfmadd231ps_fma(auVar81,auVar71,auVar69);
    auVar80 = vmulps_avx512vl(auVar73,auVar84);
    auVar81 = vmulps_avx512vl(auVar74,auVar84);
    auVar72 = vfmadd231ps_avx512vl(auVar80,auVar71,auVar72);
    auVar70 = vfmadd231ps_avx512vl(auVar81,auVar71,auVar70);
    auVar80 = vmulps_avx512vl(auVar75,auVar84);
    auVar81 = ZEXT1632(auVar41);
    auVar76 = vmulps_avx512vl(auVar76,auVar81);
    auVar73 = vfmadd231ps_avx512vl(auVar80,auVar71,auVar73);
    auVar74 = vfmadd231ps_avx512vl(auVar76,auVar71,auVar74);
    fVar205 = auVar41._0_4_;
    fVar207 = auVar41._4_4_;
    auVar18._4_4_ = fVar207 * auVar72._4_4_;
    auVar18._0_4_ = fVar205 * auVar72._0_4_;
    fVar209 = auVar41._8_4_;
    auVar18._8_4_ = fVar209 * auVar72._8_4_;
    fVar193 = auVar41._12_4_;
    auVar18._12_4_ = fVar193 * auVar72._12_4_;
    auVar18._16_4_ = auVar72._16_4_ * 0.0;
    auVar18._20_4_ = auVar72._20_4_ * 0.0;
    auVar18._24_4_ = auVar72._24_4_ * 0.0;
    auVar18._28_4_ = fVar194;
    auVar19._4_4_ = fVar207 * auVar70._4_4_;
    auVar19._0_4_ = fVar205 * auVar70._0_4_;
    auVar19._8_4_ = fVar209 * auVar70._8_4_;
    auVar19._12_4_ = fVar193 * auVar70._12_4_;
    auVar19._16_4_ = auVar70._16_4_ * 0.0;
    auVar19._20_4_ = auVar70._20_4_ * 0.0;
    auVar19._24_4_ = auVar70._24_4_ * 0.0;
    auVar19._28_4_ = auVar69._28_4_;
    auVar43 = vfmadd231ps_fma(auVar18,auVar71,ZEXT1632(auVar43));
    auVar54 = vfmadd231ps_fma(auVar19,auVar71,ZEXT1632(auVar54));
    auVar121._0_4_ = fVar205 * auVar73._0_4_;
    auVar121._4_4_ = fVar207 * auVar73._4_4_;
    auVar121._8_4_ = fVar209 * auVar73._8_4_;
    auVar121._12_4_ = fVar193 * auVar73._12_4_;
    auVar121._16_4_ = auVar73._16_4_ * 0.0;
    auVar121._20_4_ = auVar73._20_4_ * 0.0;
    auVar121._24_4_ = auVar73._24_4_ * 0.0;
    auVar121._28_4_ = 0;
    auVar20._4_4_ = fVar207 * auVar74._4_4_;
    auVar20._0_4_ = fVar205 * auVar74._0_4_;
    auVar20._8_4_ = fVar209 * auVar74._8_4_;
    auVar20._12_4_ = fVar193 * auVar74._12_4_;
    auVar20._16_4_ = auVar74._16_4_ * 0.0;
    auVar20._20_4_ = auVar74._20_4_ * 0.0;
    auVar20._24_4_ = auVar74._24_4_ * 0.0;
    auVar20._28_4_ = auVar73._28_4_;
    auVar52 = vfmadd231ps_fma(auVar121,auVar71,auVar72);
    auVar53 = vfmadd231ps_fma(auVar20,auVar71,auVar70);
    auVar21._28_4_ = auVar70._28_4_;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(fVar193 * auVar53._12_4_,
                            CONCAT48(fVar209 * auVar53._8_4_,
                                     CONCAT44(fVar207 * auVar53._4_4_,fVar205 * auVar53._0_4_))));
    auVar62 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar193 * auVar52._12_4_,
                                                 CONCAT48(fVar209 * auVar52._8_4_,
                                                          CONCAT44(fVar207 * auVar52._4_4_,
                                                                   fVar205 * auVar52._0_4_)))),
                              auVar71,ZEXT1632(auVar43));
    auVar65 = vfmadd231ps_fma(auVar21,auVar71,ZEXT1632(auVar54));
    auVar69 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar43));
    auVar72 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar54));
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar69 = vmulps_avx512vl(auVar69,auVar70);
    auVar72 = vmulps_avx512vl(auVar72,auVar70);
    auVar183._0_4_ = fVar103 * auVar69._0_4_;
    auVar183._4_4_ = fVar103 * auVar69._4_4_;
    auVar183._8_4_ = fVar103 * auVar69._8_4_;
    auVar183._12_4_ = fVar103 * auVar69._12_4_;
    auVar183._16_4_ = fVar103 * auVar69._16_4_;
    auVar183._20_4_ = fVar103 * auVar69._20_4_;
    auVar183._24_4_ = fVar103 * auVar69._24_4_;
    auVar183._28_4_ = 0;
    auVar69 = vmulps_avx512vl(auVar191,auVar72);
    auVar54 = vxorps_avx512vl(auVar75._0_16_,auVar75._0_16_);
    auVar72 = vpermt2ps_avx512vl(ZEXT1632(auVar62),_DAT_01feed00,ZEXT1632(auVar54));
    auVar73 = vpermt2ps_avx512vl(ZEXT1632(auVar65),_DAT_01feed00,ZEXT1632(auVar54));
    auVar122._0_4_ = auVar183._0_4_ + auVar62._0_4_;
    auVar122._4_4_ = auVar183._4_4_ + auVar62._4_4_;
    auVar122._8_4_ = auVar183._8_4_ + auVar62._8_4_;
    auVar122._12_4_ = auVar183._12_4_ + auVar62._12_4_;
    auVar122._16_4_ = auVar183._16_4_ + 0.0;
    auVar122._20_4_ = auVar183._20_4_ + 0.0;
    auVar122._24_4_ = auVar183._24_4_ + 0.0;
    auVar122._28_4_ = 0;
    auVar84 = ZEXT1632(auVar54);
    auVar74 = vpermt2ps_avx512vl(auVar183,_DAT_01feed00,auVar84);
    auVar75 = vaddps_avx512vl(ZEXT1632(auVar65),auVar69);
    auVar76 = vpermt2ps_avx512vl(auVar69,_DAT_01feed00,auVar84);
    auVar69 = vsubps_avx(auVar72,auVar74);
    auVar74 = vsubps_avx512vl(auVar73,auVar76);
    auVar76 = vmulps_avx512vl(auVar66,auVar81);
    auVar80 = vmulps_avx512vl(auVar82,auVar81);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar71,auVar77);
    auVar77 = vfmadd231ps_avx512vl(auVar80,auVar71,auVar78);
    auVar78 = vmulps_avx512vl(auVar67,auVar81);
    auVar80 = vmulps_avx512vl(auVar83,auVar81);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar71,auVar66);
    auVar82 = vfmadd231ps_avx512vl(auVar80,auVar71,auVar82);
    auVar68 = vmulps_avx512vl(auVar68,auVar81);
    auVar66 = vmulps_avx512vl(auVar79,auVar81);
    auVar43 = vfmadd231ps_fma(auVar68,auVar71,auVar67);
    auVar68 = vfmadd231ps_avx512vl(auVar66,auVar71,auVar83);
    auVar66 = vmulps_avx512vl(auVar81,auVar78);
    auVar79 = ZEXT1632(auVar41);
    auVar67 = vmulps_avx512vl(auVar79,auVar82);
    auVar76 = vfmadd231ps_avx512vl(auVar66,auVar71,auVar76);
    auVar77 = vfmadd231ps_avx512vl(auVar67,auVar71,auVar77);
    auVar68 = vmulps_avx512vl(auVar79,auVar68);
    auVar78 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar193 * auVar43._12_4_,
                                            CONCAT48(fVar209 * auVar43._8_4_,
                                                     CONCAT44(fVar207 * auVar43._4_4_,
                                                              fVar205 * auVar43._0_4_)))),auVar71,
                         auVar78);
    auVar82 = vfmadd231ps_avx512vl(auVar68,auVar71,auVar82);
    auVar22._4_4_ = fVar207 * auVar78._4_4_;
    auVar22._0_4_ = fVar205 * auVar78._0_4_;
    auVar22._8_4_ = fVar209 * auVar78._8_4_;
    auVar22._12_4_ = fVar193 * auVar78._12_4_;
    auVar22._16_4_ = auVar78._16_4_ * 0.0;
    auVar22._20_4_ = auVar78._20_4_ * 0.0;
    auVar22._24_4_ = auVar78._24_4_ * 0.0;
    auVar22._28_4_ = auVar83._28_4_;
    auVar83 = vmulps_avx512vl(auVar79,auVar82);
    auVar68 = vfmadd231ps_avx512vl(auVar22,auVar71,auVar76);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar77,auVar71);
    auVar71 = vsubps_avx512vl(auVar78,auVar76);
    auVar82 = vsubps_avx512vl(auVar82,auVar77);
    auVar71 = vmulps_avx512vl(auVar71,auVar70);
    auVar82 = vmulps_avx512vl(auVar82,auVar70);
    fVar194 = fVar103 * auVar71._0_4_;
    fVar205 = fVar103 * auVar71._4_4_;
    auVar23._4_4_ = fVar205;
    auVar23._0_4_ = fVar194;
    fVar207 = fVar103 * auVar71._8_4_;
    auVar23._8_4_ = fVar207;
    fVar209 = fVar103 * auVar71._12_4_;
    auVar23._12_4_ = fVar209;
    fVar193 = fVar103 * auVar71._16_4_;
    auVar23._16_4_ = fVar193;
    fVar204 = fVar103 * auVar71._20_4_;
    auVar23._20_4_ = fVar204;
    fVar103 = fVar103 * auVar71._24_4_;
    auVar23._24_4_ = fVar103;
    auVar23._28_4_ = auVar71._28_4_;
    auVar82 = vmulps_avx512vl(auVar191,auVar82);
    auVar70 = vpermt2ps_avx512vl(auVar68,_DAT_01feed00,auVar84);
    auVar76 = vpermt2ps_avx512vl(auVar83,_DAT_01feed00,auVar84);
    auVar192._0_4_ = auVar68._0_4_ + fVar194;
    auVar192._4_4_ = auVar68._4_4_ + fVar205;
    auVar192._8_4_ = auVar68._8_4_ + fVar207;
    auVar192._12_4_ = auVar68._12_4_ + fVar209;
    auVar192._16_4_ = auVar68._16_4_ + fVar193;
    auVar192._20_4_ = auVar68._20_4_ + fVar204;
    auVar192._24_4_ = auVar68._24_4_ + fVar103;
    auVar192._28_4_ = auVar68._28_4_ + auVar71._28_4_;
    auVar71 = vpermt2ps_avx512vl(auVar23,_DAT_01feed00,ZEXT1632(auVar54));
    auVar77 = vaddps_avx512vl(auVar83,auVar82);
    auVar82 = vpermt2ps_avx512vl(auVar82,_DAT_01feed00,ZEXT1632(auVar54));
    auVar71 = vsubps_avx(auVar70,auVar71);
    auVar82 = vsubps_avx512vl(auVar76,auVar82);
    auVar134 = ZEXT1632(auVar62);
    auVar78 = vsubps_avx512vl(auVar68,auVar134);
    auVar146 = ZEXT1632(auVar65);
    auVar66 = vsubps_avx512vl(auVar83,auVar146);
    auVar67 = vsubps_avx512vl(auVar70,auVar72);
    auVar78 = vaddps_avx512vl(auVar78,auVar67);
    auVar67 = vsubps_avx512vl(auVar76,auVar73);
    auVar66 = vaddps_avx512vl(auVar66,auVar67);
    auVar67 = vmulps_avx512vl(auVar146,auVar78);
    auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar134,auVar66);
    auVar79 = vmulps_avx512vl(auVar75,auVar78);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar122,auVar66);
    auVar80 = vmulps_avx512vl(auVar74,auVar78);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar69,auVar66);
    auVar81 = vmulps_avx512vl(auVar73,auVar78);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar72,auVar66);
    auVar84 = vmulps_avx512vl(auVar83,auVar78);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar68,auVar66);
    auVar85 = vmulps_avx512vl(auVar77,auVar78);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar192,auVar66);
    auVar86 = vmulps_avx512vl(auVar82,auVar78);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar71,auVar66);
    auVar78 = vmulps_avx512vl(auVar76,auVar78);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar70,auVar66);
    auVar66 = vminps_avx512vl(auVar67,auVar79);
    auVar67 = vmaxps_avx512vl(auVar67,auVar79);
    auVar79 = vminps_avx512vl(auVar80,auVar81);
    auVar66 = vminps_avx512vl(auVar66,auVar79);
    auVar79 = vmaxps_avx512vl(auVar80,auVar81);
    auVar67 = vmaxps_avx512vl(auVar67,auVar79);
    auVar79 = vminps_avx512vl(auVar84,auVar85);
    auVar80 = vmaxps_avx512vl(auVar84,auVar85);
    auVar81 = vminps_avx512vl(auVar86,auVar78);
    auVar79 = vminps_avx512vl(auVar79,auVar81);
    auVar66 = vminps_avx512vl(auVar66,auVar79);
    auVar78 = vmaxps_avx512vl(auVar86,auVar78);
    auVar78 = vmaxps_avx512vl(auVar80,auVar78);
    auVar78 = vmaxps_avx512vl(auVar67,auVar78);
    uVar12 = vcmpps_avx512vl(auVar66,local_440,2);
    uVar13 = vcmpps_avx512vl(auVar78,local_460,5);
    bVar31 = (byte)uVar12 & (byte)uVar13 & 0x7f;
    if (bVar31 != 0) {
      auVar78 = vsubps_avx512vl(auVar72,auVar134);
      auVar66 = vsubps_avx512vl(auVar73,auVar146);
      auVar67 = vsubps_avx512vl(auVar70,auVar68);
      auVar78 = vaddps_avx512vl(auVar78,auVar67);
      auVar67 = vsubps_avx512vl(auVar76,auVar83);
      auVar66 = vaddps_avx512vl(auVar66,auVar67);
      auVar67 = vmulps_avx512vl(auVar146,auVar78);
      auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar66,auVar134);
      auVar75 = vmulps_avx512vl(auVar75,auVar78);
      auVar75 = vfnmadd213ps_avx512vl(auVar122,auVar66,auVar75);
      auVar74 = vmulps_avx512vl(auVar74,auVar78);
      auVar74 = vfnmadd213ps_avx512vl(auVar69,auVar66,auVar74);
      auVar69 = vmulps_avx512vl(auVar73,auVar78);
      auVar73 = vfnmadd231ps_avx512vl(auVar69,auVar66,auVar72);
      auVar69 = vmulps_avx512vl(auVar83,auVar78);
      auVar83 = vfnmadd231ps_avx512vl(auVar69,auVar66,auVar68);
      auVar69 = vmulps_avx512vl(auVar77,auVar78);
      auVar68 = vfnmadd213ps_avx512vl(auVar192,auVar66,auVar69);
      auVar69 = vmulps_avx512vl(auVar82,auVar78);
      auVar77 = vfnmadd213ps_avx512vl(auVar71,auVar66,auVar69);
      auVar71 = vmulps_avx512vl(auVar76,auVar78);
      auVar70 = vfnmadd231ps_avx512vl(auVar71,auVar70,auVar66);
      auVar69 = vminps_avx(auVar67,auVar75);
      auVar71 = vmaxps_avx(auVar67,auVar75);
      auVar72 = vminps_avx(auVar74,auVar73);
      auVar72 = vminps_avx(auVar69,auVar72);
      auVar69 = vmaxps_avx(auVar74,auVar73);
      auVar71 = vmaxps_avx(auVar71,auVar69);
      auVar82 = vminps_avx(auVar83,auVar68);
      auVar69 = vmaxps_avx(auVar83,auVar68);
      auVar83 = vminps_avx(auVar77,auVar70);
      auVar82 = vminps_avx(auVar82,auVar83);
      auVar82 = vminps_avx(auVar72,auVar82);
      auVar72 = vmaxps_avx(auVar77,auVar70);
      auVar69 = vmaxps_avx(auVar69,auVar72);
      auVar71 = vmaxps_avx(auVar71,auVar69);
      uVar12 = vcmpps_avx512vl(auVar71,local_460,5);
      uVar13 = vcmpps_avx512vl(auVar82,local_440,2);
      bVar31 = bVar31 & (byte)uVar12 & (byte)uVar13;
      if (bVar31 != 0) {
        auStack_600[uVar26] = (uint)bVar31;
        uVar12 = vmovlps_avx(auVar48);
        (&uStack_420)[uVar26] = uVar12;
        uVar28 = vmovlps_avx(auVar42);
        auStack_3a0[uVar26] = uVar28;
        uVar26 = (ulong)((int)uVar26 + 1);
      }
    }
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar109 = ZEXT1664(auVar48);
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar237 = ZEXT1664(auVar48);
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar238 = ZEXT1664(auVar48);
    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar239 = ZEXT3264(auVar71);
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar240 = ZEXT1664(auVar48);
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar241 = ZEXT1664(auVar48);
    auVar88._32_32_ = auVar87._32_32_;
    auVar88._0_32_ = _DAT_01feed20;
    auVar242 = ZEXT3264(_DAT_01feed20);
    auVar89._16_48_ = auVar88._16_48_;
    auVar89._0_16_ = auVar40;
LAB_01d07c1b:
    do {
      do {
        if ((int)uVar26 == 0) {
          if (bVar25) {
            return bVar25;
          }
          uVar104 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar17._4_4_ = uVar104;
          auVar17._0_4_ = uVar104;
          auVar17._8_4_ = uVar104;
          auVar17._12_4_ = uVar104;
          auVar17._16_4_ = uVar104;
          auVar17._20_4_ = uVar104;
          auVar17._24_4_ = uVar104;
          auVar17._28_4_ = uVar104;
          uVar12 = vcmpps_avx512vl(local_3c0,auVar17,2);
          uVar35 = (uint)uVar34 & local_628 & (uint)uVar12;
          uVar34 = (ulong)uVar35;
          if (uVar35 == 0) {
            return bVar25;
          }
          goto LAB_01d07020;
        }
        uVar32 = (int)uVar26 - 1;
        uVar33 = (ulong)uVar32;
        uVar7 = auStack_600[uVar33];
        auVar42._8_8_ = 0;
        auVar42._0_8_ = auStack_3a0[uVar33];
        uVar28 = 0;
        for (uVar29 = (ulong)uVar7; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
          uVar28 = uVar28 + 1;
        }
        uVar27 = uVar7 - 1 & uVar7;
        bVar38 = uVar27 == 0;
        auStack_600[uVar33] = uVar27;
        if (bVar38) {
          uVar26 = (ulong)uVar32;
        }
        auVar105._8_8_ = 0;
        auVar105._0_8_ = uVar28;
        auVar48 = vpunpcklqdq_avx(auVar105,ZEXT416((int)uVar28 + 1));
        auVar87._32_32_ = auVar89._32_32_;
        auVar48 = vcvtqq2ps_avx512vl(auVar48);
        auVar48 = vmulps_avx512vl(auVar48,auVar240._0_16_);
        uVar104 = *(undefined4 *)((long)&uStack_420 + uVar33 * 8 + 4);
        auVar14._4_4_ = uVar104;
        auVar14._0_4_ = uVar104;
        auVar14._8_4_ = uVar104;
        auVar14._12_4_ = uVar104;
        auVar41 = vmulps_avx512vl(auVar48,auVar14);
        auVar43 = auVar241._0_16_;
        auVar48 = vsubps_avx512vl(auVar43,auVar48);
        uVar104 = *(undefined4 *)(&uStack_420 + uVar33);
        auVar15._4_4_ = uVar104;
        auVar15._0_4_ = uVar104;
        auVar15._8_4_ = uVar104;
        auVar15._12_4_ = uVar104;
        auVar48 = vfmadd231ps_avx512vl(auVar41,auVar48,auVar15);
        auVar41 = vmovshdup_avx(auVar48);
        fVar103 = auVar41._0_4_ - auVar48._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar103));
        if (uVar7 == 0 || bVar38) goto LAB_01d07713;
        auVar41 = vshufps_avx(auVar42,auVar42,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar103));
        auVar53 = vsubps_avx512vl(auVar43,auVar41);
        fVar194 = auVar41._0_4_;
        auVar141._0_4_ = fVar194 * fVar110;
        fVar205 = auVar41._4_4_;
        auVar141._4_4_ = fVar205 * fVar111;
        fVar207 = auVar41._8_4_;
        auVar141._8_4_ = fVar207 * fVar110;
        fVar209 = auVar41._12_4_;
        auVar141._12_4_ = fVar209 * fVar111;
        auVar150._0_4_ = fVar194 * fVar112;
        auVar150._4_4_ = fVar205 * fVar123;
        auVar150._8_4_ = fVar207 * fVar112;
        auVar150._12_4_ = fVar209 * fVar123;
        auVar156._0_4_ = fVar194 * fVar163;
        auVar156._4_4_ = fVar205 * fVar164;
        auVar156._8_4_ = fVar207 * fVar163;
        auVar156._12_4_ = fVar209 * fVar164;
        auVar125._0_4_ = fVar194 * fVar206;
        auVar125._4_4_ = fVar205 * fVar208;
        auVar125._8_4_ = fVar207 * fVar206;
        auVar125._12_4_ = fVar209 * fVar208;
        auVar41 = vfmadd231ps_fma(auVar141,auVar53,auVar50);
        auVar54 = vfmadd231ps_fma(auVar150,auVar53,auVar51);
        auVar52 = vfmadd231ps_fma(auVar156,auVar53,auVar167);
        auVar53 = vfmadd231ps_fma(auVar125,auVar53,auVar174);
        auVar135._16_16_ = auVar41;
        auVar135._0_16_ = auVar41;
        auVar147._16_16_ = auVar54;
        auVar147._0_16_ = auVar54;
        auVar154._16_16_ = auVar52;
        auVar154._0_16_ = auVar52;
        auVar69 = vpermps_avx512vl(auVar242._0_32_,ZEXT1632(auVar48));
        auVar71 = vsubps_avx(auVar147,auVar135);
        auVar54 = vfmadd213ps_fma(auVar71,auVar69,auVar135);
        auVar71 = vsubps_avx(auVar154,auVar147);
        auVar62 = vfmadd213ps_fma(auVar71,auVar69,auVar147);
        auVar41 = vsubps_avx(auVar53,auVar52);
        auVar148._16_16_ = auVar41;
        auVar148._0_16_ = auVar41;
        auVar41 = vfmadd213ps_fma(auVar148,auVar69,auVar154);
        auVar71 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar54));
        auVar54 = vfmadd213ps_fma(auVar71,auVar69,ZEXT1632(auVar54));
        auVar71 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar62));
        auVar41 = vfmadd213ps_fma(auVar71,auVar69,ZEXT1632(auVar62));
        auVar71 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar54));
        auVar115 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar71,auVar69);
        auVar87._0_32_ = vmulps_avx512vl(auVar71,auVar239._0_32_);
        fVar194 = fVar103 * 0.33333334;
        auVar157._0_8_ =
             CONCAT44(auVar115._4_4_ + fVar194 * auVar87._4_4_,
                      auVar115._0_4_ + fVar194 * auVar87._0_4_);
        auVar157._8_4_ = auVar115._8_4_ + fVar194 * auVar87._8_4_;
        auVar157._12_4_ = auVar115._12_4_ + fVar194 * auVar87._12_4_;
        auVar142._0_4_ = fVar194 * auVar87._16_4_;
        auVar142._4_4_ = fVar194 * auVar87._20_4_;
        auVar142._8_4_ = fVar194 * auVar87._24_4_;
        auVar142._12_4_ = fVar194 * auVar87._28_4_;
        auVar61 = vsubps_avx((undefined1  [16])0x0,auVar142);
        auVar62 = vshufpd_avx(auVar115,auVar115,3);
        auVar65 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar41 = vsubps_avx(auVar62,auVar115);
        auVar54 = vsubps_avx(auVar65,(undefined1  [16])0x0);
        auVar175._0_4_ = auVar41._0_4_ + auVar54._0_4_;
        auVar175._4_4_ = auVar41._4_4_ + auVar54._4_4_;
        auVar175._8_4_ = auVar41._8_4_ + auVar54._8_4_;
        auVar175._12_4_ = auVar41._12_4_ + auVar54._12_4_;
        auVar41 = vshufps_avx(auVar115,auVar115,0xb1);
        auVar54 = vshufps_avx(auVar157,auVar157,0xb1);
        auVar52 = vshufps_avx(auVar61,auVar61,0xb1);
        auVar53 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar228._4_4_ = auVar175._0_4_;
        auVar228._0_4_ = auVar175._0_4_;
        auVar228._8_4_ = auVar175._0_4_;
        auVar228._12_4_ = auVar175._0_4_;
        auVar57 = vshufps_avx(auVar175,auVar175,0x55);
        fVar194 = auVar57._0_4_;
        auVar188._0_4_ = auVar41._0_4_ * fVar194;
        fVar205 = auVar57._4_4_;
        auVar188._4_4_ = auVar41._4_4_ * fVar205;
        fVar207 = auVar57._8_4_;
        auVar188._8_4_ = auVar41._8_4_ * fVar207;
        fVar209 = auVar57._12_4_;
        auVar188._12_4_ = auVar41._12_4_ * fVar209;
        auVar196._0_4_ = auVar54._0_4_ * fVar194;
        auVar196._4_4_ = auVar54._4_4_ * fVar205;
        auVar196._8_4_ = auVar54._8_4_ * fVar207;
        auVar196._12_4_ = auVar54._12_4_ * fVar209;
        auVar213._0_4_ = auVar52._0_4_ * fVar194;
        auVar213._4_4_ = auVar52._4_4_ * fVar205;
        auVar213._8_4_ = auVar52._8_4_ * fVar207;
        auVar213._12_4_ = auVar52._12_4_ * fVar209;
        auVar176._0_4_ = auVar53._0_4_ * fVar194;
        auVar176._4_4_ = auVar53._4_4_ * fVar205;
        auVar176._8_4_ = auVar53._8_4_ * fVar207;
        auVar176._12_4_ = auVar53._12_4_ * fVar209;
        auVar41 = vfmadd231ps_fma(auVar188,auVar228,auVar115);
        auVar54 = vfmadd231ps_fma(auVar196,auVar228,auVar157);
        auVar59 = vfmadd231ps_fma(auVar213,auVar228,auVar61);
        auVar60 = vfmadd231ps_fma(auVar176,(undefined1  [16])0x0,auVar228);
        auVar57 = vshufpd_avx(auVar41,auVar41,1);
        auVar58 = vshufpd_avx(auVar54,auVar54,1);
        auVar89._16_48_ = auVar87._16_48_;
        auVar55 = vshufpd_avx512vl(auVar59,auVar59,1);
        auVar56 = vshufpd_avx512vl(auVar60,auVar60,1);
        auVar52 = vminss_avx(auVar41,auVar54);
        auVar41 = vmaxss_avx(auVar54,auVar41);
        auVar53 = vminss_avx(auVar59,auVar60);
        auVar54 = vmaxss_avx(auVar60,auVar59);
        auVar52 = vminss_avx(auVar52,auVar53);
        auVar41 = vmaxss_avx(auVar54,auVar41);
        auVar53 = vminss_avx(auVar57,auVar58);
        auVar54 = vmaxss_avx(auVar58,auVar57);
        auVar57 = vminss_avx512f(auVar55,auVar56);
        auVar58 = vmaxss_avx512f(auVar56,auVar55);
        auVar54 = vmaxss_avx(auVar58,auVar54);
        auVar89._0_16_ = vminss_avx512f(auVar53,auVar57);
        fVar205 = auVar54._0_4_;
        fVar194 = auVar41._0_4_;
        if (auVar52._0_4_ < 0.0001) {
          bVar39 = fVar205 == -0.0001;
          bVar36 = NAN(fVar205);
          if (fVar205 <= -0.0001) goto LAB_01d07e4d;
          break;
        }
LAB_01d07e4d:
        vucomiss_avx512f(auVar89._0_16_);
        bVar39 = fVar205 <= -0.0001;
        bVar37 = -0.0001 < fVar194;
        bVar36 = bVar39;
        if (!bVar39) break;
        uVar28 = vcmpps_avx512vl(auVar52,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar29 = vcmpps_avx512vl(auVar89._0_16_,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar24 = (uVar28 & uVar29 & 1) == 0;
        bVar39 = bVar37 && bVar24;
        bVar36 = bVar37 && (uVar28 & uVar29 & 1) == 0;
      } while (!bVar37 || !bVar24);
      auVar58 = auVar243._0_16_;
      vcmpss_avx512f(auVar52,auVar58,1);
      uVar12 = vcmpss_avx512f(auVar41,auVar58,1);
      bVar37 = (bool)((byte)uVar12 & 1);
      auVar91._16_48_ = auVar89._16_48_;
      auVar91._0_16_ = auVar244._0_16_;
      auVar90._4_60_ = auVar91._4_60_;
      auVar90._0_4_ = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * auVar244._0_4_);
      vucomiss_avx512f(auVar90._0_16_);
      bVar36 = (bool)(!bVar39 | bVar36);
      bVar37 = bVar36 == false;
      auVar93._16_48_ = auVar89._16_48_;
      auVar93._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar92._4_60_ = auVar93._4_60_;
      auVar92._0_4_ = (uint)bVar36 * auVar243._0_4_ + (uint)!bVar36 * 0x7f800000;
      auVar57 = auVar92._0_16_;
      auVar95._16_48_ = auVar89._16_48_;
      auVar95._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar94._4_60_ = auVar95._4_60_;
      auVar94._0_4_ = (uint)bVar36 * auVar243._0_4_ + (uint)!bVar36 * -0x800000;
      auVar53 = auVar94._0_16_;
      uVar12 = vcmpss_avx512f(auVar89._0_16_,auVar58,1);
      bVar39 = (bool)((byte)uVar12 & 1);
      auVar97._16_48_ = auVar89._16_48_;
      auVar97._0_16_ = auVar244._0_16_;
      auVar96._4_60_ = auVar97._4_60_;
      auVar96._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * auVar244._0_4_);
      vucomiss_avx512f(auVar96._0_16_);
      if ((bVar36) || (bVar37)) {
        auVar59 = vucomiss_avx512f(auVar52);
        if ((bVar36) || (bVar37)) {
          auVar60 = vxorps_avx512vl(auVar52,auVar238._0_16_);
          auVar52 = vsubss_avx512f(auVar59,auVar52);
          auVar52 = vdivss_avx512f(auVar60,auVar52);
          auVar59 = vsubss_avx512f(ZEXT416(0x3f800000),auVar52);
          auVar59 = vfmadd213ss_avx512f(auVar59,auVar58,auVar52);
          auVar52 = auVar59;
        }
        else {
          auVar52 = vxorps_avx512vl(auVar59,auVar59);
          vucomiss_avx512f(auVar52);
          auVar59 = ZEXT416(0x3f800000);
          if ((bVar36) || (bVar37)) {
            auVar59 = SUB6416(ZEXT464(0xff800000),0);
            auVar52 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar57 = vminss_avx512f(auVar57,auVar52);
        auVar53 = vmaxss_avx(auVar59,auVar53);
      }
      auVar244 = ZEXT464(0x3f800000);
      uVar12 = vcmpss_avx512f(auVar54,auVar58,1);
      bVar39 = (bool)((byte)uVar12 & 1);
      auVar54 = auVar244._0_16_;
      fVar207 = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * 0x3f800000);
      if ((auVar90._0_4_ != fVar207) || (NAN(auVar90._0_4_) || NAN(fVar207))) {
        if ((fVar205 != fVar194) || (NAN(fVar205) || NAN(fVar194))) {
          auVar41 = vxorps_avx512vl(auVar41,auVar238._0_16_);
          auVar177._0_4_ = auVar41._0_4_ / (fVar205 - fVar194);
          auVar177._4_12_ = auVar41._4_12_;
          auVar41 = vsubss_avx512f(auVar54,auVar177);
          auVar41 = vfmadd213ss_avx512f(auVar41,auVar58,auVar177);
          auVar52 = auVar41;
        }
        else if ((fVar194 != 0.0) ||
                (auVar41 = auVar54, auVar52 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar194))) {
          auVar41 = SUB6416(ZEXT464(0xff800000),0);
          auVar52 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar57 = vminss_avx(auVar57,auVar52);
        auVar53 = vmaxss_avx(auVar41,auVar53);
      }
      bVar39 = auVar96._0_4_ != fVar207;
      auVar41 = vminss_avx512f(auVar57,auVar54);
      auVar99._16_48_ = auVar89._16_48_;
      auVar99._0_16_ = auVar57;
      auVar98._4_60_ = auVar99._4_60_;
      auVar98._0_4_ = (uint)bVar39 * auVar41._0_4_ + (uint)!bVar39 * auVar57._0_4_;
      auVar41 = vmaxss_avx512f(auVar54,auVar53);
      auVar101._16_48_ = auVar89._16_48_;
      auVar101._0_16_ = auVar53;
      auVar100._4_60_ = auVar101._4_60_;
      auVar100._0_4_ = (uint)bVar39 * auVar41._0_4_ + (uint)!bVar39 * auVar53._0_4_;
      auVar41 = vmaxss_avx512f(auVar58,auVar98._0_16_);
      auVar89._0_16_ = vminss_avx512f(auVar100._0_16_,auVar54);
    } while (auVar89._0_4_ < auVar41._0_4_);
    auVar59 = vmaxss_avx512f(auVar58,ZEXT416((uint)(auVar41._0_4_ + -0.1)));
    auVar60 = vminss_avx512f(ZEXT416((uint)(auVar89._0_4_ + 0.1)),auVar54);
    auVar126._0_8_ = auVar115._0_8_;
    auVar126._8_8_ = auVar126._0_8_;
    auVar197._8_8_ = auVar157._0_8_;
    auVar197._0_8_ = auVar157._0_8_;
    auVar214._8_8_ = auVar61._0_8_;
    auVar214._0_8_ = auVar61._0_8_;
    auVar41 = vshufpd_avx(auVar157,auVar157,3);
    auVar52 = vshufpd_avx(auVar61,auVar61,3);
    auVar53 = vshufps_avx(auVar59,auVar60,0);
    auVar58 = vsubps_avx512vl(auVar43,auVar53);
    fVar194 = auVar53._0_4_;
    auVar151._0_4_ = fVar194 * auVar62._0_4_;
    fVar205 = auVar53._4_4_;
    auVar151._4_4_ = fVar205 * auVar62._4_4_;
    fVar207 = auVar53._8_4_;
    auVar151._8_4_ = fVar207 * auVar62._8_4_;
    fVar209 = auVar53._12_4_;
    auVar151._12_4_ = fVar209 * auVar62._12_4_;
    auVar158._0_4_ = fVar194 * auVar41._0_4_;
    auVar158._4_4_ = fVar205 * auVar41._4_4_;
    auVar158._8_4_ = fVar207 * auVar41._8_4_;
    auVar158._12_4_ = fVar209 * auVar41._12_4_;
    auVar231._0_4_ = auVar52._0_4_ * fVar194;
    auVar231._4_4_ = auVar52._4_4_ * fVar205;
    auVar231._8_4_ = auVar52._8_4_ * fVar207;
    auVar231._12_4_ = auVar52._12_4_ * fVar209;
    auVar143._0_4_ = fVar194 * auVar65._0_4_;
    auVar143._4_4_ = fVar205 * auVar65._4_4_;
    auVar143._8_4_ = fVar207 * auVar65._8_4_;
    auVar143._12_4_ = fVar209 * auVar65._12_4_;
    auVar62 = vfmadd231ps_fma(auVar151,auVar58,auVar126);
    auVar65 = vfmadd231ps_fma(auVar158,auVar58,auVar197);
    auVar57 = vfmadd231ps_fma(auVar231,auVar58,auVar214);
    auVar58 = vfmadd231ps_fma(auVar143,auVar58,ZEXT816(0));
    auVar52 = vsubss_avx512f(auVar54,auVar59);
    auVar41 = vmovshdup_avx(auVar42);
    auVar115 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * auVar59._0_4_)),auVar42,auVar52);
    auVar52 = vsubss_avx512f(auVar54,auVar60);
    auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * auVar60._0_4_)),auVar42,auVar52);
    auVar61 = vdivss_avx512f(auVar54,ZEXT416((uint)fVar103));
    auVar41 = vsubps_avx(auVar65,auVar62);
    auVar136 = auVar109._0_16_;
    auVar52 = vmulps_avx512vl(auVar41,auVar136);
    auVar41 = vsubps_avx(auVar57,auVar65);
    auVar53 = vmulps_avx512vl(auVar41,auVar136);
    auVar41 = vsubps_avx(auVar58,auVar57);
    auVar41 = vmulps_avx512vl(auVar41,auVar136);
    auVar42 = vminps_avx(auVar53,auVar41);
    auVar41 = vmaxps_avx(auVar53,auVar41);
    auVar42 = vminps_avx(auVar52,auVar42);
    auVar41 = vmaxps_avx(auVar52,auVar41);
    auVar52 = vshufpd_avx(auVar42,auVar42,3);
    auVar53 = vshufpd_avx(auVar41,auVar41,3);
    auVar42 = vminps_avx(auVar42,auVar52);
    auVar41 = vmaxps_avx(auVar41,auVar53);
    fVar103 = auVar61._0_4_;
    auVar178._0_4_ = auVar42._0_4_ * fVar103;
    auVar178._4_4_ = auVar42._4_4_ * fVar103;
    auVar178._8_4_ = auVar42._8_4_ * fVar103;
    auVar178._12_4_ = auVar42._12_4_ * fVar103;
    auVar168._0_4_ = fVar103 * auVar41._0_4_;
    auVar168._4_4_ = fVar103 * auVar41._4_4_;
    auVar168._8_4_ = fVar103 * auVar41._8_4_;
    auVar168._12_4_ = fVar103 * auVar41._12_4_;
    auVar61 = vdivss_avx512f(auVar54,ZEXT416((uint)(auVar55._0_4_ - auVar115._0_4_)));
    auVar41 = vshufpd_avx(auVar62,auVar62,3);
    auVar42 = vshufpd_avx(auVar65,auVar65,3);
    auVar52 = vshufpd_avx(auVar57,auVar57,3);
    auVar53 = vshufpd_avx(auVar58,auVar58,3);
    auVar41 = vsubps_avx(auVar41,auVar62);
    auVar62 = vsubps_avx(auVar42,auVar65);
    auVar65 = vsubps_avx(auVar52,auVar57);
    auVar53 = vsubps_avx(auVar53,auVar58);
    auVar42 = vminps_avx(auVar41,auVar62);
    auVar41 = vmaxps_avx(auVar41,auVar62);
    auVar52 = vminps_avx(auVar65,auVar53);
    auVar52 = vminps_avx(auVar42,auVar52);
    auVar42 = vmaxps_avx(auVar65,auVar53);
    auVar41 = vmaxps_avx(auVar41,auVar42);
    fVar103 = auVar61._0_4_;
    auVar215._0_4_ = fVar103 * auVar52._0_4_;
    auVar215._4_4_ = fVar103 * auVar52._4_4_;
    auVar215._8_4_ = fVar103 * auVar52._8_4_;
    auVar215._12_4_ = fVar103 * auVar52._12_4_;
    auVar198._0_4_ = fVar103 * auVar41._0_4_;
    auVar198._4_4_ = fVar103 * auVar41._4_4_;
    auVar198._8_4_ = fVar103 * auVar41._8_4_;
    auVar198._12_4_ = fVar103 * auVar41._12_4_;
    auVar53 = vinsertps_avx(auVar48,auVar115,0x10);
    auVar56 = vpermt2ps_avx512vl(auVar48,_DAT_01feecd0,auVar55);
    auVar114._0_4_ = auVar53._0_4_ + auVar56._0_4_;
    auVar114._4_4_ = auVar53._4_4_ + auVar56._4_4_;
    auVar114._8_4_ = auVar53._8_4_ + auVar56._8_4_;
    auVar114._12_4_ = auVar53._12_4_ + auVar56._12_4_;
    auVar16._8_4_ = 0x3f000000;
    auVar16._0_8_ = 0x3f0000003f000000;
    auVar16._12_4_ = 0x3f000000;
    auVar61 = vmulps_avx512vl(auVar114,auVar16);
    auVar42 = vshufps_avx(auVar61,auVar61,0x54);
    uVar104 = auVar61._0_4_;
    auVar117._4_4_ = uVar104;
    auVar117._0_4_ = uVar104;
    auVar117._8_4_ = uVar104;
    auVar117._12_4_ = uVar104;
    auVar52 = vfmadd213ps_fma(auVar40,auVar117,auVar3);
    auVar62 = vfmadd213ps_fma(local_470,auVar117,auVar49);
    auVar65 = vfmadd213ps_fma(local_480,auVar117,auVar45);
    auVar41 = vsubps_avx(auVar62,auVar52);
    auVar52 = vfmadd213ps_fma(auVar41,auVar117,auVar52);
    auVar41 = vsubps_avx(auVar65,auVar62);
    auVar41 = vfmadd213ps_fma(auVar41,auVar117,auVar62);
    auVar41 = vsubps_avx(auVar41,auVar52);
    auVar52 = vfmadd231ps_fma(auVar52,auVar41,auVar117);
    auVar57 = vmulps_avx512vl(auVar41,auVar136);
    auVar223._8_8_ = auVar52._0_8_;
    auVar223._0_8_ = auVar52._0_8_;
    auVar41 = vshufpd_avx(auVar52,auVar52,3);
    auVar52 = vshufps_avx(auVar61,auVar61,0x55);
    auVar62 = vsubps_avx(auVar41,auVar223);
    auVar65 = vfmadd231ps_fma(auVar223,auVar52,auVar62);
    auVar232._8_8_ = auVar57._0_8_;
    auVar232._0_8_ = auVar57._0_8_;
    auVar41 = vshufpd_avx(auVar57,auVar57,3);
    auVar41 = vsubps_avx512vl(auVar41,auVar232);
    auVar41 = vfmadd213ps_avx512vl(auVar41,auVar52,auVar232);
    auVar118._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
    auVar118._8_4_ = auVar62._8_4_ ^ 0x80000000;
    auVar118._12_4_ = auVar62._12_4_ ^ 0x80000000;
    auVar52 = vmovshdup_avx512vl(auVar41);
    auVar233._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
    auVar233._8_4_ = auVar52._8_4_ ^ 0x80000000;
    auVar233._12_4_ = auVar52._12_4_ ^ 0x80000000;
    auVar57 = vmovshdup_avx512vl(auVar62);
    auVar58 = vpermt2ps_avx512vl(auVar233,ZEXT416(5),auVar62);
    auVar52 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar52._0_4_ * auVar62._0_4_)),auVar41,auVar57);
    auVar62 = vpermt2ps_avx512vl(auVar41,SUB6416(ZEXT464(4),0),auVar118);
    auVar144._0_4_ = auVar52._0_4_;
    auVar144._4_4_ = auVar144._0_4_;
    auVar144._8_4_ = auVar144._0_4_;
    auVar144._12_4_ = auVar144._0_4_;
    auVar41 = vdivps_avx(auVar58,auVar144);
    auVar63 = vdivps_avx512vl(auVar62,auVar144);
    fVar103 = auVar65._0_4_;
    auVar52 = vshufps_avx(auVar65,auVar65,0x55);
    auVar224._0_4_ = fVar103 * auVar41._0_4_ + auVar52._0_4_ * auVar63._0_4_;
    auVar224._4_4_ = fVar103 * auVar41._4_4_ + auVar52._4_4_ * auVar63._4_4_;
    auVar224._8_4_ = fVar103 * auVar41._8_4_ + auVar52._8_4_ * auVar63._8_4_;
    auVar224._12_4_ = fVar103 * auVar41._12_4_ + auVar52._12_4_ * auVar63._12_4_;
    auVar59 = vsubps_avx(auVar42,auVar224);
    auVar52 = vmovshdup_avx(auVar41);
    auVar42 = vinsertps_avx(auVar178,auVar215,0x1c);
    auVar234._0_4_ = auVar52._0_4_ * auVar42._0_4_;
    auVar234._4_4_ = auVar52._4_4_ * auVar42._4_4_;
    auVar234._8_4_ = auVar52._8_4_ * auVar42._8_4_;
    auVar234._12_4_ = auVar52._12_4_ * auVar42._12_4_;
    auVar60 = vinsertps_avx512f(auVar168,auVar198,0x1c);
    auVar52 = vmulps_avx512vl(auVar52,auVar60);
    auVar58 = vminps_avx512vl(auVar234,auVar52);
    auVar65 = vmaxps_avx(auVar52,auVar234);
    auVar57 = vmovshdup_avx(auVar63);
    auVar52 = vinsertps_avx(auVar215,auVar178,0x4c);
    auVar216._0_4_ = auVar57._0_4_ * auVar52._0_4_;
    auVar216._4_4_ = auVar57._4_4_ * auVar52._4_4_;
    auVar216._8_4_ = auVar57._8_4_ * auVar52._8_4_;
    auVar216._12_4_ = auVar57._12_4_ * auVar52._12_4_;
    auVar62 = vinsertps_avx(auVar198,auVar168,0x4c);
    auVar199._0_4_ = auVar57._0_4_ * auVar62._0_4_;
    auVar199._4_4_ = auVar57._4_4_ * auVar62._4_4_;
    auVar199._8_4_ = auVar57._8_4_ * auVar62._8_4_;
    auVar199._12_4_ = auVar57._12_4_ * auVar62._12_4_;
    auVar57 = vminps_avx(auVar216,auVar199);
    auVar58 = vaddps_avx512vl(auVar58,auVar57);
    auVar57 = vmaxps_avx(auVar199,auVar216);
    auVar200._0_4_ = auVar65._0_4_ + auVar57._0_4_;
    auVar200._4_4_ = auVar65._4_4_ + auVar57._4_4_;
    auVar200._8_4_ = auVar65._8_4_ + auVar57._8_4_;
    auVar200._12_4_ = auVar65._12_4_ + auVar57._12_4_;
    auVar217._8_8_ = 0x3f80000000000000;
    auVar217._0_8_ = 0x3f80000000000000;
    auVar65 = vsubps_avx(auVar217,auVar200);
    auVar57 = vsubps_avx(auVar217,auVar58);
    auVar58 = vsubps_avx(auVar53,auVar61);
    auVar61 = vsubps_avx(auVar56,auVar61);
    fVar209 = auVar58._0_4_;
    auVar235._0_4_ = fVar209 * auVar65._0_4_;
    fVar193 = auVar58._4_4_;
    auVar235._4_4_ = fVar193 * auVar65._4_4_;
    fVar204 = auVar58._8_4_;
    auVar235._8_4_ = fVar204 * auVar65._8_4_;
    fVar210 = auVar58._12_4_;
    auVar235._12_4_ = fVar210 * auVar65._12_4_;
    auVar64 = vbroadcastss_avx512vl(auVar41);
    auVar42 = vmulps_avx512vl(auVar64,auVar42);
    auVar60 = vmulps_avx512vl(auVar64,auVar60);
    auVar64 = vminps_avx512vl(auVar42,auVar60);
    auVar60 = vmaxps_avx512vl(auVar60,auVar42);
    auVar42 = vbroadcastss_avx512vl(auVar63);
    auVar52 = vmulps_avx512vl(auVar42,auVar52);
    auVar42 = vmulps_avx512vl(auVar42,auVar62);
    auVar62 = vminps_avx512vl(auVar52,auVar42);
    auVar62 = vaddps_avx512vl(auVar64,auVar62);
    auVar58 = vmulps_avx512vl(auVar58,auVar57);
    fVar103 = auVar61._0_4_;
    auVar201._0_4_ = fVar103 * auVar65._0_4_;
    fVar194 = auVar61._4_4_;
    auVar201._4_4_ = fVar194 * auVar65._4_4_;
    fVar205 = auVar61._8_4_;
    auVar201._8_4_ = fVar205 * auVar65._8_4_;
    fVar207 = auVar61._12_4_;
    auVar201._12_4_ = fVar207 * auVar65._12_4_;
    auVar218._0_4_ = fVar103 * auVar57._0_4_;
    auVar218._4_4_ = fVar194 * auVar57._4_4_;
    auVar218._8_4_ = fVar205 * auVar57._8_4_;
    auVar218._12_4_ = fVar207 * auVar57._12_4_;
    auVar42 = vmaxps_avx(auVar42,auVar52);
    auVar169._0_4_ = auVar60._0_4_ + auVar42._0_4_;
    auVar169._4_4_ = auVar60._4_4_ + auVar42._4_4_;
    auVar169._8_4_ = auVar60._8_4_ + auVar42._8_4_;
    auVar169._12_4_ = auVar60._12_4_ + auVar42._12_4_;
    auVar179._8_8_ = 0x3f800000;
    auVar179._0_8_ = 0x3f800000;
    auVar42 = vsubps_avx(auVar179,auVar169);
    auVar52 = vsubps_avx512vl(auVar179,auVar62);
    auVar229._0_4_ = fVar209 * auVar42._0_4_;
    auVar229._4_4_ = fVar193 * auVar42._4_4_;
    auVar229._8_4_ = fVar204 * auVar42._8_4_;
    auVar229._12_4_ = fVar210 * auVar42._12_4_;
    auVar225._0_4_ = fVar209 * auVar52._0_4_;
    auVar225._4_4_ = fVar193 * auVar52._4_4_;
    auVar225._8_4_ = fVar204 * auVar52._8_4_;
    auVar225._12_4_ = fVar210 * auVar52._12_4_;
    auVar170._0_4_ = fVar103 * auVar42._0_4_;
    auVar170._4_4_ = fVar194 * auVar42._4_4_;
    auVar170._8_4_ = fVar205 * auVar42._8_4_;
    auVar170._12_4_ = fVar207 * auVar42._12_4_;
    auVar180._0_4_ = fVar103 * auVar52._0_4_;
    auVar180._4_4_ = fVar194 * auVar52._4_4_;
    auVar180._8_4_ = fVar205 * auVar52._8_4_;
    auVar180._12_4_ = fVar207 * auVar52._12_4_;
    auVar42 = vminps_avx(auVar229,auVar225);
    auVar52 = vminps_avx512vl(auVar170,auVar180);
    auVar62 = vminps_avx512vl(auVar42,auVar52);
    auVar42 = vmaxps_avx(auVar225,auVar229);
    auVar52 = vmaxps_avx(auVar180,auVar170);
    auVar52 = vmaxps_avx(auVar52,auVar42);
    auVar65 = vminps_avx512vl(auVar235,auVar58);
    auVar42 = vminps_avx(auVar201,auVar218);
    auVar42 = vminps_avx(auVar65,auVar42);
    auVar42 = vhaddps_avx(auVar62,auVar42);
    auVar65 = vmaxps_avx512vl(auVar58,auVar235);
    auVar62 = vmaxps_avx(auVar218,auVar201);
    auVar62 = vmaxps_avx(auVar62,auVar65);
    auVar52 = vhaddps_avx(auVar52,auVar62);
    auVar42 = vshufps_avx(auVar42,auVar42,0xe8);
    auVar52 = vshufps_avx(auVar52,auVar52,0xe8);
    auVar171._0_4_ = auVar42._0_4_ + auVar59._0_4_;
    auVar171._4_4_ = auVar42._4_4_ + auVar59._4_4_;
    auVar171._8_4_ = auVar42._8_4_ + auVar59._8_4_;
    auVar171._12_4_ = auVar42._12_4_ + auVar59._12_4_;
    auVar181._0_4_ = auVar52._0_4_ + auVar59._0_4_;
    auVar181._4_4_ = auVar52._4_4_ + auVar59._4_4_;
    auVar181._8_4_ = auVar52._8_4_ + auVar59._8_4_;
    auVar181._12_4_ = auVar52._12_4_ + auVar59._12_4_;
    auVar42 = vmaxps_avx(auVar53,auVar171);
    auVar52 = vminps_avx(auVar181,auVar56);
    uVar28 = vcmpps_avx512vl(auVar52,auVar42,1);
    auVar42 = ZEXT416(5);
    if ((uVar28 & 3) != 0) {
      auVar89._0_16_ = vxorps_avx512vl(ZEXT416(5),auVar42);
      auVar243 = ZEXT1664(auVar89._0_16_);
      goto LAB_01d07c1b;
    }
    uVar28 = vcmpps_avx512vl(auVar181,auVar56,1);
    uVar12 = vcmpps_avx512vl(auVar48,auVar171,1);
    if (((ushort)uVar12 & (ushort)uVar28 & 1) == 0) {
      bVar31 = 0;
    }
    else {
      auVar52 = vmovshdup_avx(auVar171);
      bVar31 = auVar115._0_4_ < auVar52._0_4_ & (byte)(uVar28 >> 1) & 0x7f;
    }
    auVar102._0_16_ = vxorps_avx512vl(auVar42,auVar42);
    auVar102._16_48_ = auVar89._16_48_;
    auVar243 = ZEXT1664(auVar102._0_16_);
    local_610 = auVar4._0_4_;
    fStack_60c = auVar4._4_4_;
    fStack_608 = auVar4._8_4_;
    fStack_604 = auVar4._12_4_;
    if (((3 < (uint)uVar26 || uVar7 != 0 && !bVar38) | bVar31) == 1) {
      lVar30 = 200;
      auVar89 = auVar102;
      do {
        auVar48 = vsubss_avx512f(auVar54,auVar59);
        fVar205 = auVar48._0_4_;
        fVar103 = fVar205 * fVar205 * fVar205;
        fVar207 = auVar59._0_4_;
        fVar194 = fVar207 * 3.0 * fVar205 * fVar205;
        fVar205 = fVar205 * fVar207 * fVar207 * 3.0;
        auVar132._4_4_ = fVar103;
        auVar132._0_4_ = fVar103;
        auVar132._8_4_ = fVar103;
        auVar132._12_4_ = fVar103;
        auVar127._4_4_ = fVar194;
        auVar127._0_4_ = fVar194;
        auVar127._8_4_ = fVar194;
        auVar127._12_4_ = fVar194;
        auVar106._4_4_ = fVar205;
        auVar106._0_4_ = fVar205;
        auVar106._8_4_ = fVar205;
        auVar106._12_4_ = fVar205;
        fVar207 = fVar207 * fVar207 * fVar207;
        auVar152._0_4_ = local_610 * fVar207;
        auVar152._4_4_ = fStack_60c * fVar207;
        auVar152._8_4_ = fStack_608 * fVar207;
        auVar152._12_4_ = fStack_604 * fVar207;
        auVar48 = vfmadd231ps_fma(auVar152,auVar45,auVar106);
        auVar48 = vfmadd231ps_fma(auVar48,auVar49,auVar127);
        auVar48 = vfmadd231ps_fma(auVar48,auVar3,auVar132);
        auVar107._8_8_ = auVar48._0_8_;
        auVar107._0_8_ = auVar48._0_8_;
        auVar48 = vshufpd_avx(auVar48,auVar48,3);
        auVar42 = vshufps_avx(auVar59,auVar59,0x55);
        auVar48 = vsubps_avx(auVar48,auVar107);
        auVar42 = vfmadd213ps_fma(auVar48,auVar42,auVar107);
        fVar103 = auVar42._0_4_;
        auVar48 = vshufps_avx(auVar42,auVar42,0x55);
        auVar108._0_4_ = auVar41._0_4_ * fVar103 + auVar63._0_4_ * auVar48._0_4_;
        auVar108._4_4_ = auVar41._4_4_ * fVar103 + auVar63._4_4_ * auVar48._4_4_;
        auVar108._8_4_ = auVar41._8_4_ * fVar103 + auVar63._8_4_ * auVar48._8_4_;
        auVar108._12_4_ = auVar41._12_4_ * fVar103 + auVar63._12_4_ * auVar48._12_4_;
        auVar59 = vsubps_avx(auVar59,auVar108);
        auVar48 = vandps_avx512vl(auVar42,auVar237._0_16_);
        auVar89._0_16_ = vprolq_avx512vl(auVar48,0x20);
        auVar48 = vmaxss_avx(auVar89._0_16_,auVar48);
        bVar38 = auVar48._0_4_ <= fVar124;
        if (auVar48._0_4_ < fVar124) {
          auVar48 = vucomiss_avx512f(auVar102._0_16_);
          if (bVar38) {
            auVar41 = vucomiss_avx512f(auVar48);
            auVar244 = ZEXT1664(auVar41);
            if (bVar38) {
              vmovshdup_avx(auVar48);
              auVar41 = vucomiss_avx512f(auVar102._0_16_);
              if (bVar38) {
                auVar42 = vucomiss_avx512f(auVar41);
                auVar244 = ZEXT1664(auVar42);
                if (bVar38) {
                  auVar54 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar61 = vinsertps_avx(auVar54,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar54 = vdpps_avx(auVar61,local_490,0x7f);
                  auVar52 = vdpps_avx(auVar61,local_4a0,0x7f);
                  auVar53 = vdpps_avx(auVar61,local_4b0,0x7f);
                  auVar62 = vdpps_avx(auVar61,local_4c0,0x7f);
                  auVar65 = vdpps_avx(auVar61,local_4d0,0x7f);
                  auVar57 = vdpps_avx(auVar61,local_4e0,0x7f);
                  auVar58 = vdpps_avx(auVar61,local_4f0,0x7f);
                  auVar61 = vdpps_avx(auVar61,local_500,0x7f);
                  auVar59 = vsubss_avx512f(auVar42,auVar41);
                  fVar103 = auVar41._0_4_;
                  auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * auVar65._0_4_)),auVar59,auVar54
                                           );
                  auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * fVar103)),auVar59,auVar52
                                           );
                  auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar103)),auVar59,auVar53
                                           );
                  auVar53 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * auVar61._0_4_)),auVar59,auVar62
                                           );
                  auVar89._0_16_ = vsubss_avx512f(auVar42,auVar48);
                  auVar153._0_4_ = auVar89._0_4_;
                  fVar103 = auVar153._0_4_ * auVar153._0_4_ * auVar153._0_4_;
                  fVar207 = auVar48._0_4_;
                  fVar194 = fVar207 * 3.0 * auVar153._0_4_ * auVar153._0_4_;
                  fVar205 = auVar153._0_4_ * fVar207 * fVar207 * 3.0;
                  fVar209 = fVar207 * fVar207 * fVar207;
                  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar53._0_4_)),
                                            ZEXT416((uint)fVar205),auVar52);
                  auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar194),auVar54);
                  vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar103),auVar41);
                  auVar41 = vucomiss_avx512f(ZEXT416(uVar35));
                  if (bVar38) {
                    fVar193 = *(float *)(ray + k * 4 + 0x200);
                    if (auVar41._0_4_ <= fVar193) {
                      auVar42 = vshufps_avx(auVar48,auVar48,0x55);
                      auVar52 = vsubps_avx512vl(auVar43,auVar42);
                      fVar204 = auVar42._0_4_;
                      auVar182._0_4_ = fVar204 * (float)local_520._0_4_;
                      fVar210 = auVar42._4_4_;
                      auVar182._4_4_ = fVar210 * (float)local_520._4_4_;
                      fVar219 = auVar42._8_4_;
                      auVar182._8_4_ = fVar219 * fStack_518;
                      fVar220 = auVar42._12_4_;
                      auVar182._12_4_ = fVar220 * fStack_514;
                      auVar189._0_4_ = fVar204 * (float)local_570._0_4_;
                      auVar189._4_4_ = fVar210 * (float)local_570._4_4_;
                      auVar189._8_4_ = fVar219 * fStack_568;
                      auVar189._12_4_ = fVar220 * fStack_564;
                      auVar202._0_4_ = fVar204 * (float)local_580._0_4_;
                      auVar202._4_4_ = fVar210 * (float)local_580._4_4_;
                      auVar202._8_4_ = fVar219 * fStack_578;
                      auVar202._12_4_ = fVar220 * fStack_574;
                      auVar159._0_4_ = fVar204 * (float)local_540._0_4_;
                      auVar159._4_4_ = fVar210 * (float)local_540._4_4_;
                      auVar159._8_4_ = fVar219 * fStack_538;
                      auVar159._12_4_ = fVar220 * fStack_534;
                      auVar42 = vfmadd231ps_fma(auVar182,auVar52,local_510);
                      auVar43 = vfmadd231ps_fma(auVar189,auVar52,local_550);
                      auVar54 = vfmadd231ps_fma(auVar202,auVar52,local_560);
                      auVar52 = vfmadd231ps_fma(auVar159,auVar52,local_530);
                      auVar42 = vsubps_avx(auVar43,auVar42);
                      auVar43 = vsubps_avx(auVar54,auVar43);
                      auVar54 = vsubps_avx(auVar52,auVar54);
                      auVar203._0_4_ = fVar207 * auVar43._0_4_;
                      auVar203._4_4_ = fVar207 * auVar43._4_4_;
                      auVar203._8_4_ = fVar207 * auVar43._8_4_;
                      auVar203._12_4_ = fVar207 * auVar43._12_4_;
                      auVar153._4_4_ = auVar153._0_4_;
                      auVar153._8_4_ = auVar153._0_4_;
                      auVar153._12_4_ = auVar153._0_4_;
                      auVar42 = vfmadd231ps_fma(auVar203,auVar153,auVar42);
                      auVar160._0_4_ = fVar207 * auVar54._0_4_;
                      auVar160._4_4_ = fVar207 * auVar54._4_4_;
                      auVar160._8_4_ = fVar207 * auVar54._8_4_;
                      auVar160._12_4_ = fVar207 * auVar54._12_4_;
                      auVar43 = vfmadd231ps_fma(auVar160,auVar153,auVar43);
                      auVar161._0_4_ = fVar207 * auVar43._0_4_;
                      auVar161._4_4_ = fVar207 * auVar43._4_4_;
                      auVar161._8_4_ = fVar207 * auVar43._8_4_;
                      auVar161._12_4_ = fVar207 * auVar43._12_4_;
                      auVar42 = vfmadd231ps_fma(auVar161,auVar153,auVar42);
                      auVar89._0_16_ = vmulps_avx512vl(auVar42,auVar136);
                      pGVar8 = (context->scene->geometries).items[uVar6].ptr;
                      if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
LAB_01d08b94:
                        bVar31 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar31 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar145._0_4_ = fVar209 * (float)local_5c0._0_4_;
                        auVar145._4_4_ = fVar209 * (float)local_5c0._4_4_;
                        auVar145._8_4_ = fVar209 * fStack_5b8;
                        auVar145._12_4_ = fVar209 * fStack_5b4;
                        auVar133._4_4_ = fVar205;
                        auVar133._0_4_ = fVar205;
                        auVar133._8_4_ = fVar205;
                        auVar133._12_4_ = fVar205;
                        auVar42 = vfmadd132ps_fma(auVar133,auVar145,local_5b0);
                        auVar128._4_4_ = fVar194;
                        auVar128._0_4_ = fVar194;
                        auVar128._8_4_ = fVar194;
                        auVar128._12_4_ = fVar194;
                        auVar42 = vfmadd132ps_fma(auVar128,auVar42,local_5a0);
                        auVar119._4_4_ = fVar103;
                        auVar119._0_4_ = fVar103;
                        auVar119._8_4_ = fVar103;
                        auVar119._12_4_ = fVar103;
                        auVar54 = vfmadd132ps_fma(auVar119,auVar42,local_590);
                        auVar42 = vshufps_avx(auVar54,auVar54,0xc9);
                        auVar43 = vshufps_avx(auVar89._0_16_,auVar89._0_16_,0xc9);
                        auVar120._0_4_ = auVar54._0_4_ * auVar43._0_4_;
                        auVar120._4_4_ = auVar54._4_4_ * auVar43._4_4_;
                        auVar120._8_4_ = auVar54._8_4_ * auVar43._8_4_;
                        auVar120._12_4_ = auVar54._12_4_ * auVar43._12_4_;
                        auVar42 = vfmsub231ps_fma(auVar120,auVar89._0_16_,auVar42);
                        local_200 = vbroadcastss_avx512f(auVar48);
                        auVar237 = vbroadcastss_avx512f(ZEXT416(1));
                        local_1c0 = vpermps_avx512f(auVar237,ZEXT1664(auVar48));
                        auVar237 = vpermps_avx512f(auVar237,ZEXT1664(auVar42));
                        auVar243 = vbroadcastss_avx512f(ZEXT416(2));
                        local_280 = vpermps_avx512f(auVar243,ZEXT1664(auVar42));
                        local_240 = vbroadcastss_avx512f(auVar42);
                        local_2c0[0] = (RTCHitN)auVar237[0];
                        local_2c0[1] = (RTCHitN)auVar237[1];
                        local_2c0[2] = (RTCHitN)auVar237[2];
                        local_2c0[3] = (RTCHitN)auVar237[3];
                        local_2c0[4] = (RTCHitN)auVar237[4];
                        local_2c0[5] = (RTCHitN)auVar237[5];
                        local_2c0[6] = (RTCHitN)auVar237[6];
                        local_2c0[7] = (RTCHitN)auVar237[7];
                        local_2c0[8] = (RTCHitN)auVar237[8];
                        local_2c0[9] = (RTCHitN)auVar237[9];
                        local_2c0[10] = (RTCHitN)auVar237[10];
                        local_2c0[0xb] = (RTCHitN)auVar237[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar237[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar237[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar237[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar237[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar237[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar237[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar237[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar237[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar237[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar237[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar237[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar237[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar237[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar237[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar237[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar237[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar237[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar237[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar237[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar237[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar237[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar237[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar237[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar237[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar237[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar237[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar237[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar237[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar237[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar237[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar237[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar237[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar237[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar237[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar237[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar237[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar237[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar237[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar237[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar237[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar237[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar237[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar237[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar237[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar237[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar237[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar237[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar237[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar237[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar237[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar237[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar237[0x3f];
                        local_180 = local_300._0_8_;
                        uStack_178 = local_300._8_8_;
                        uStack_170 = local_300._16_8_;
                        uStack_168 = local_300._24_8_;
                        uStack_160 = local_300._32_8_;
                        uStack_158 = local_300._40_8_;
                        uStack_150 = local_300._48_8_;
                        uStack_148 = local_300._56_8_;
                        auVar237 = vmovdqa64_avx512f(local_340);
                        local_140 = vmovdqa64_avx512f(auVar237);
                        vpcmpeqd_avx2(auVar237._0_32_,auVar237._0_32_);
                        local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = auVar41._0_4_;
                        auVar87 = vmovdqa64_avx512f(local_380);
                        local_400 = vmovdqa64_avx512f(auVar87);
                        local_5f0.valid = (int *)local_400;
                        local_5f0.geometryUserPtr = pGVar8->userPtr;
                        local_5f0.context = context->user;
                        local_5f0.ray = (RTCRayN *)ray;
                        local_5f0.hit = local_2c0;
                        local_5f0.N = 0x10;
                        if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar8->occlusionFilterN)(&local_5f0);
                          auVar244 = ZEXT464(0x3f800000);
                          auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar241 = ZEXT1664(auVar48);
                          auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                          auVar238 = ZEXT1664(auVar48);
                          auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar109 = ZEXT1664(auVar48);
                          auVar87 = vmovdqa64_avx512f(local_400);
                        }
                        uVar12 = vptestmd_avx512f(auVar87,auVar87);
                        auVar243._32_32_ = auVar87._32_32_;
                        if ((short)uVar12 == 0) {
                          auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
                          auVar245 = ZEXT1664(auVar48);
                          auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar237 = ZEXT1664(auVar48);
                          auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar239 = ZEXT3264(auVar71);
                          auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar240 = ZEXT1664(auVar48);
                          auVar243._0_32_ = _DAT_01feed20;
                          auVar242 = ZEXT3264(_DAT_01feed20);
                          auVar89._16_48_ = auVar243._16_48_;
                          auVar48 = vxorps_avx512vl(auVar102._0_16_,auVar102._0_16_);
                          auVar243 = ZEXT1664(auVar48);
                          auVar89._0_16_ = auVar40;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if (p_Var11 == (RTCFilterFunctionN)0x0) {
                            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
                            auVar245 = ZEXT1664(auVar48);
                            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar237 = ZEXT1664(auVar48);
                            auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar239 = ZEXT3264(auVar71);
                            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar240 = ZEXT1664(auVar48);
                            auVar242 = ZEXT3264(_DAT_01feed20);
                            auVar48 = vxorps_avx512vl(auVar102._0_16_,auVar102._0_16_);
                            auVar243 = ZEXT1664(auVar48);
                          }
                          else {
                            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
                            auVar245 = ZEXT1664(auVar48);
                            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar237 = ZEXT1664(auVar48);
                            auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar239 = ZEXT3264(auVar71);
                            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar240 = ZEXT1664(auVar48);
                            auVar242 = ZEXT3264(_DAT_01feed20);
                            auVar48 = vxorps_avx512vl(auVar102._0_16_,auVar102._0_16_);
                            auVar243 = ZEXT1664(auVar48);
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var11)(&local_5f0);
                              auVar48 = vxorps_avx512vl(auVar48,auVar48);
                              auVar243 = ZEXT1664(auVar48);
                              auVar244 = ZEXT464(0x3f800000);
                              auVar242 = ZEXT3264(_DAT_01feed20);
                              auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar241 = ZEXT1664(auVar48);
                              auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                              auVar240 = ZEXT1664(auVar48);
                              auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar239 = ZEXT3264(auVar71);
                              auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar238 = ZEXT1664(auVar48);
                              auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar237 = ZEXT1664(auVar48);
                              auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar109 = ZEXT1664(auVar48);
                              auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
                              auVar245 = ZEXT1664(auVar48);
                              auVar87 = vmovdqa64_avx512f(local_400);
                            }
                          }
                          uVar28 = vptestmd_avx512f(auVar87,auVar87);
                          auVar87 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar38 = (bool)((byte)uVar28 & 1);
                          auVar89._0_4_ =
                               (uint)bVar38 * auVar87._0_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x200);
                          bVar38 = (bool)((byte)(uVar28 >> 1) & 1);
                          auVar89._4_4_ =
                               (uint)bVar38 * auVar87._4_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x204);
                          bVar38 = (bool)((byte)(uVar28 >> 2) & 1);
                          auVar89._8_4_ =
                               (uint)bVar38 * auVar87._8_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x208);
                          bVar38 = (bool)((byte)(uVar28 >> 3) & 1);
                          auVar89._12_4_ =
                               (uint)bVar38 * auVar87._12_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x20c);
                          bVar38 = (bool)((byte)(uVar28 >> 4) & 1);
                          auVar89._16_4_ =
                               (uint)bVar38 * auVar87._16_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x210);
                          bVar38 = (bool)((byte)(uVar28 >> 5) & 1);
                          auVar89._20_4_ =
                               (uint)bVar38 * auVar87._20_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x214);
                          bVar38 = (bool)((byte)(uVar28 >> 6) & 1);
                          auVar89._24_4_ =
                               (uint)bVar38 * auVar87._24_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x218);
                          bVar38 = (bool)((byte)(uVar28 >> 7) & 1);
                          auVar89._28_4_ =
                               (uint)bVar38 * auVar87._28_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x21c);
                          bVar38 = (bool)((byte)(uVar28 >> 8) & 1);
                          auVar89._32_4_ =
                               (uint)bVar38 * auVar87._32_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x220);
                          bVar38 = (bool)((byte)(uVar28 >> 9) & 1);
                          auVar89._36_4_ =
                               (uint)bVar38 * auVar87._36_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x224);
                          bVar38 = (bool)((byte)(uVar28 >> 10) & 1);
                          auVar89._40_4_ =
                               (uint)bVar38 * auVar87._40_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x228);
                          bVar38 = (bool)((byte)(uVar28 >> 0xb) & 1);
                          auVar89._44_4_ =
                               (uint)bVar38 * auVar87._44_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x22c);
                          bVar38 = (bool)((byte)(uVar28 >> 0xc) & 1);
                          auVar89._48_4_ =
                               (uint)bVar38 * auVar87._48_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x230);
                          bVar38 = (bool)((byte)(uVar28 >> 0xd) & 1);
                          auVar89._52_4_ =
                               (uint)bVar38 * auVar87._52_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x234);
                          bVar38 = (bool)((byte)(uVar28 >> 0xe) & 1);
                          auVar89._56_4_ =
                               (uint)bVar38 * auVar87._56_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x238);
                          bVar38 = SUB81(uVar28 >> 0xf,0);
                          auVar89._60_4_ =
                               (uint)bVar38 * auVar87._60_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x23c);
                          *(undefined1 (*) [64])(local_5f0.ray + 0x200) = auVar89;
                          bVar31 = 1;
                          if ((short)uVar28 != 0) goto LAB_01d08b96;
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar193;
                        goto LAB_01d08b94;
                      }
LAB_01d08b96:
                      bVar25 = (bool)(bVar25 | bVar31);
                    }
                  }
                }
              }
            }
          }
          break;
        }
        lVar30 = lVar30 + -1;
      } while (lVar30 != 0);
      goto LAB_01d07c1b;
    }
    auVar42 = vinsertps_avx(auVar115,auVar55,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }